

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_rtcd.h
# Opt level: O0

void setup_rtcd_internal(void)

{
  uint uVar1;
  int flags;
  
  uVar1 = x86_simd_caps();
  aom_avg_8x8_quad = aom_avg_8x8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_avg_8x8_quad = aom_avg_8x8_quad_avx2;
  }
  aom_blend_a64_hmask = aom_blend_a64_hmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_hmask = aom_blend_a64_hmask_sse4_1;
  }
  aom_blend_a64_mask = aom_blend_a64_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_mask = aom_blend_a64_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_blend_a64_mask = aom_blend_a64_mask_avx2;
  }
  aom_blend_a64_vmask = aom_blend_a64_vmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_vmask = aom_blend_a64_vmask_sse4_1;
  }
  aom_comp_avg_pred = aom_comp_avg_pred_c;
  if ((uVar1 & 0x80) != 0) {
    aom_comp_avg_pred = aom_comp_avg_pred_avx2;
  }
  aom_comp_mask_pred = aom_comp_mask_pred_c;
  if ((uVar1 & 0x10) != 0) {
    aom_comp_mask_pred = aom_comp_mask_pred_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_comp_mask_pred = aom_comp_mask_pred_avx2;
  }
  aom_compute_correlation = aom_compute_correlation_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_correlation = aom_compute_correlation_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_correlation = aom_compute_correlation_avx2;
  }
  aom_compute_flow_at_point = aom_compute_flow_at_point_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_flow_at_point = aom_compute_flow_at_point_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_flow_at_point = aom_compute_flow_at_point_avx2;
  }
  aom_compute_mean_stddev = aom_compute_mean_stddev_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_mean_stddev = aom_compute_mean_stddev_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_mean_stddev = aom_compute_mean_stddev_avx2;
  }
  aom_convolve8_horiz = aom_convolve8_horiz_c;
  if ((uVar1 & 0x10) != 0) {
    aom_convolve8_horiz = aom_convolve8_horiz_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_convolve8_horiz = aom_convolve8_horiz_avx2;
  }
  aom_convolve8_vert = aom_convolve8_vert_c;
  if ((uVar1 & 0x10) != 0) {
    aom_convolve8_vert = aom_convolve8_vert_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_convolve8_vert = aom_convolve8_vert_avx2;
  }
  aom_convolve_copy = aom_convolve_copy_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_convolve_copy = aom_convolve_copy_avx2;
  }
  aom_dc_128_predictor_32x16 = aom_dc_128_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x16 = aom_dc_128_predictor_32x16_avx2;
  }
  aom_dc_128_predictor_32x32 = aom_dc_128_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x32 = aom_dc_128_predictor_32x32_avx2;
  }
  aom_dc_128_predictor_32x64 = aom_dc_128_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x64 = aom_dc_128_predictor_32x64_avx2;
  }
  aom_dc_128_predictor_64x16 = aom_dc_128_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x16 = aom_dc_128_predictor_64x16_avx2;
  }
  aom_dc_128_predictor_64x32 = aom_dc_128_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x32 = aom_dc_128_predictor_64x32_avx2;
  }
  aom_dc_128_predictor_64x64 = aom_dc_128_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x64 = aom_dc_128_predictor_64x64_avx2;
  }
  aom_dc_left_predictor_32x16 = aom_dc_left_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x16 = aom_dc_left_predictor_32x16_avx2;
  }
  aom_dc_left_predictor_32x32 = aom_dc_left_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x32 = aom_dc_left_predictor_32x32_avx2;
  }
  aom_dc_left_predictor_32x64 = aom_dc_left_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x64 = aom_dc_left_predictor_32x64_avx2;
  }
  aom_dc_left_predictor_64x16 = aom_dc_left_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x16 = aom_dc_left_predictor_64x16_avx2;
  }
  aom_dc_left_predictor_64x32 = aom_dc_left_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x32 = aom_dc_left_predictor_64x32_avx2;
  }
  aom_dc_left_predictor_64x64 = aom_dc_left_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x64 = aom_dc_left_predictor_64x64_avx2;
  }
  aom_dc_predictor_32x16 = aom_dc_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x16 = aom_dc_predictor_32x16_avx2;
  }
  aom_dc_predictor_32x32 = aom_dc_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x32 = aom_dc_predictor_32x32_avx2;
  }
  aom_dc_predictor_32x64 = aom_dc_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x64 = aom_dc_predictor_32x64_avx2;
  }
  aom_dc_predictor_64x16 = aom_dc_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x16 = aom_dc_predictor_64x16_avx2;
  }
  aom_dc_predictor_64x32 = aom_dc_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x32 = aom_dc_predictor_64x32_avx2;
  }
  aom_dc_predictor_64x64 = aom_dc_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x64 = aom_dc_predictor_64x64_avx2;
  }
  aom_dc_top_predictor_32x16 = aom_dc_top_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x16 = aom_dc_top_predictor_32x16_avx2;
  }
  aom_dc_top_predictor_32x32 = aom_dc_top_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x32 = aom_dc_top_predictor_32x32_avx2;
  }
  aom_dc_top_predictor_32x64 = aom_dc_top_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x64 = aom_dc_top_predictor_32x64_avx2;
  }
  aom_dc_top_predictor_64x16 = aom_dc_top_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x16 = aom_dc_top_predictor_64x16_avx2;
  }
  aom_dc_top_predictor_64x32 = aom_dc_top_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x32 = aom_dc_top_predictor_64x32_avx2;
  }
  aom_dc_top_predictor_64x64 = aom_dc_top_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x64 = aom_dc_top_predictor_64x64_avx2;
  }
  aom_fft16x16_float = aom_fft16x16_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft16x16_float = aom_fft16x16_float_avx2;
  }
  aom_fft32x32_float = aom_fft32x32_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft32x32_float = aom_fft32x32_float_avx2;
  }
  aom_fft8x8_float = aom_fft8x8_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft8x8_float = aom_fft8x8_float_avx2;
  }
  aom_get_blk_sse_sum = aom_get_blk_sse_sum_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_blk_sse_sum = aom_get_blk_sse_sum_avx2;
  }
  aom_get_var_sse_sum_16x16_dual = aom_get_var_sse_sum_16x16_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_var_sse_sum_16x16_dual = aom_get_var_sse_sum_16x16_dual_avx2;
  }
  aom_get_var_sse_sum_8x8_quad = aom_get_var_sse_sum_8x8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_var_sse_sum_8x8_quad = aom_get_var_sse_sum_8x8_quad_avx2;
  }
  aom_h_predictor_32x32 = aom_h_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_h_predictor_32x32 = aom_h_predictor_32x32_avx2;
  }
  aom_hadamard_16x16 = aom_hadamard_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_16x16 = aom_hadamard_16x16_avx2;
  }
  aom_hadamard_32x32 = aom_hadamard_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_32x32 = aom_hadamard_32x32_avx2;
  }
  aom_hadamard_lp_16x16 = aom_hadamard_lp_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_lp_16x16 = aom_hadamard_lp_16x16_avx2;
  }
  aom_hadamard_lp_8x8_dual = aom_hadamard_lp_8x8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_lp_8x8_dual = aom_hadamard_lp_8x8_dual_avx2;
  }
  aom_highbd_10_masked_sub_pixel_variance128x128 = aom_highbd_10_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance128x128 =
         aom_highbd_10_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance128x64 = aom_highbd_10_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance128x64 =
         aom_highbd_10_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x16 = aom_highbd_10_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x16 =
         aom_highbd_10_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x32 = aom_highbd_10_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x32 =
         aom_highbd_10_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x4 = aom_highbd_10_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x4 = aom_highbd_10_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x64 = aom_highbd_10_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x64 =
         aom_highbd_10_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x8 = aom_highbd_10_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x8 = aom_highbd_10_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x16 = aom_highbd_10_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x16 =
         aom_highbd_10_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x32 = aom_highbd_10_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x32 =
         aom_highbd_10_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x64 = aom_highbd_10_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x64 =
         aom_highbd_10_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x8 = aom_highbd_10_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x8 = aom_highbd_10_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x16 = aom_highbd_10_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x16 = aom_highbd_10_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x4 = aom_highbd_10_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x4 = aom_highbd_10_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x8 = aom_highbd_10_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x8 = aom_highbd_10_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x128 = aom_highbd_10_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x128 =
         aom_highbd_10_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x16 = aom_highbd_10_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x16 =
         aom_highbd_10_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x32 = aom_highbd_10_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x32 =
         aom_highbd_10_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x64 = aom_highbd_10_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x64 =
         aom_highbd_10_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x16 = aom_highbd_10_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x16 = aom_highbd_10_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x32 = aom_highbd_10_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x32 = aom_highbd_10_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x4 = aom_highbd_10_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x4 = aom_highbd_10_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x8 = aom_highbd_10_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x8 = aom_highbd_10_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_10_mse16x16 = aom_highbd_10_mse16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_mse16x16 = aom_highbd_10_mse16x16_avx2;
  }
  aom_highbd_10_obmc_variance128x128 = aom_highbd_10_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance128x128 = aom_highbd_10_obmc_variance128x128_sse4_1;
  }
  aom_highbd_10_obmc_variance128x64 = aom_highbd_10_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance128x64 = aom_highbd_10_obmc_variance128x64_sse4_1;
  }
  aom_highbd_10_obmc_variance16x16 = aom_highbd_10_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x16 = aom_highbd_10_obmc_variance16x16_sse4_1;
  }
  aom_highbd_10_obmc_variance16x32 = aom_highbd_10_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x32 = aom_highbd_10_obmc_variance16x32_sse4_1;
  }
  aom_highbd_10_obmc_variance16x4 = aom_highbd_10_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x4 = aom_highbd_10_obmc_variance16x4_sse4_1;
  }
  aom_highbd_10_obmc_variance16x64 = aom_highbd_10_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x64 = aom_highbd_10_obmc_variance16x64_sse4_1;
  }
  aom_highbd_10_obmc_variance16x8 = aom_highbd_10_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x8 = aom_highbd_10_obmc_variance16x8_sse4_1;
  }
  aom_highbd_10_obmc_variance32x16 = aom_highbd_10_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x16 = aom_highbd_10_obmc_variance32x16_sse4_1;
  }
  aom_highbd_10_obmc_variance32x32 = aom_highbd_10_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x32 = aom_highbd_10_obmc_variance32x32_sse4_1;
  }
  aom_highbd_10_obmc_variance32x64 = aom_highbd_10_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x64 = aom_highbd_10_obmc_variance32x64_sse4_1;
  }
  aom_highbd_10_obmc_variance32x8 = aom_highbd_10_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x8 = aom_highbd_10_obmc_variance32x8_sse4_1;
  }
  aom_highbd_10_obmc_variance4x16 = aom_highbd_10_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x16 = aom_highbd_10_obmc_variance4x16_sse4_1;
  }
  aom_highbd_10_obmc_variance4x4 = aom_highbd_10_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x4 = aom_highbd_10_obmc_variance4x4_sse4_1;
  }
  aom_highbd_10_obmc_variance4x8 = aom_highbd_10_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x8 = aom_highbd_10_obmc_variance4x8_sse4_1;
  }
  aom_highbd_10_obmc_variance64x128 = aom_highbd_10_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x128 = aom_highbd_10_obmc_variance64x128_sse4_1;
  }
  aom_highbd_10_obmc_variance64x16 = aom_highbd_10_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x16 = aom_highbd_10_obmc_variance64x16_sse4_1;
  }
  aom_highbd_10_obmc_variance64x32 = aom_highbd_10_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x32 = aom_highbd_10_obmc_variance64x32_sse4_1;
  }
  aom_highbd_10_obmc_variance64x64 = aom_highbd_10_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x64 = aom_highbd_10_obmc_variance64x64_sse4_1;
  }
  aom_highbd_10_obmc_variance8x16 = aom_highbd_10_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x16 = aom_highbd_10_obmc_variance8x16_sse4_1;
  }
  aom_highbd_10_obmc_variance8x32 = aom_highbd_10_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x32 = aom_highbd_10_obmc_variance8x32_sse4_1;
  }
  aom_highbd_10_obmc_variance8x4 = aom_highbd_10_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x4 = aom_highbd_10_obmc_variance8x4_sse4_1;
  }
  aom_highbd_10_obmc_variance8x8 = aom_highbd_10_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x8 = aom_highbd_10_obmc_variance8x8_sse4_1;
  }
  aom_highbd_10_sub_pixel_avg_variance4x4 = aom_highbd_10_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_sub_pixel_avg_variance4x4 = aom_highbd_10_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_10_sub_pixel_variance128x128 = aom_highbd_10_sub_pixel_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance128x128 = aom_highbd_10_sub_pixel_variance128x128_avx2;
  }
  aom_highbd_10_sub_pixel_variance128x64 = aom_highbd_10_sub_pixel_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance128x64 = aom_highbd_10_sub_pixel_variance128x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x16 = aom_highbd_10_sub_pixel_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x16 = aom_highbd_10_sub_pixel_variance16x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x32 = aom_highbd_10_sub_pixel_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x32 = aom_highbd_10_sub_pixel_variance16x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x8 = aom_highbd_10_sub_pixel_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x8 = aom_highbd_10_sub_pixel_variance16x8_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x16 = aom_highbd_10_sub_pixel_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x16 = aom_highbd_10_sub_pixel_variance32x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x32 = aom_highbd_10_sub_pixel_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x32 = aom_highbd_10_sub_pixel_variance32x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x64 = aom_highbd_10_sub_pixel_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x64 = aom_highbd_10_sub_pixel_variance32x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance4x4 = aom_highbd_10_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_sub_pixel_variance4x4 = aom_highbd_10_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_10_sub_pixel_variance64x128 = aom_highbd_10_sub_pixel_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x128 = aom_highbd_10_sub_pixel_variance64x128_avx2;
  }
  aom_highbd_10_sub_pixel_variance64x32 = aom_highbd_10_sub_pixel_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x32 = aom_highbd_10_sub_pixel_variance64x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance64x64 = aom_highbd_10_sub_pixel_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x64 = aom_highbd_10_sub_pixel_variance64x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance8x16 = aom_highbd_10_sub_pixel_variance8x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance8x16 = aom_highbd_10_sub_pixel_variance8x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance8x8 = aom_highbd_10_sub_pixel_variance8x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance8x8 = aom_highbd_10_sub_pixel_variance8x8_avx2;
  }
  aom_highbd_10_variance128x128 = aom_highbd_10_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance128x128 = aom_highbd_10_variance128x128_avx2;
  }
  aom_highbd_10_variance128x64 = aom_highbd_10_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance128x64 = aom_highbd_10_variance128x64_avx2;
  }
  aom_highbd_10_variance16x16 = aom_highbd_10_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x16 = aom_highbd_10_variance16x16_avx2;
  }
  aom_highbd_10_variance16x32 = aom_highbd_10_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x32 = aom_highbd_10_variance16x32_avx2;
  }
  aom_highbd_10_variance16x64 = aom_highbd_10_variance16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x64 = aom_highbd_10_variance16x64_avx2;
  }
  aom_highbd_10_variance16x8 = aom_highbd_10_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x8 = aom_highbd_10_variance16x8_avx2;
  }
  aom_highbd_10_variance32x16 = aom_highbd_10_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x16 = aom_highbd_10_variance32x16_avx2;
  }
  aom_highbd_10_variance32x32 = aom_highbd_10_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x32 = aom_highbd_10_variance32x32_avx2;
  }
  aom_highbd_10_variance32x64 = aom_highbd_10_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x64 = aom_highbd_10_variance32x64_avx2;
  }
  aom_highbd_10_variance32x8 = aom_highbd_10_variance32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x8 = aom_highbd_10_variance32x8_avx2;
  }
  aom_highbd_10_variance4x4 = aom_highbd_10_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_variance4x4 = aom_highbd_10_variance4x4_sse4_1;
  }
  aom_highbd_10_variance64x128 = aom_highbd_10_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x128 = aom_highbd_10_variance64x128_avx2;
  }
  aom_highbd_10_variance64x16 = aom_highbd_10_variance64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x16 = aom_highbd_10_variance64x16_avx2;
  }
  aom_highbd_10_variance64x32 = aom_highbd_10_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x32 = aom_highbd_10_variance64x32_avx2;
  }
  aom_highbd_10_variance64x64 = aom_highbd_10_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x64 = aom_highbd_10_variance64x64_avx2;
  }
  aom_highbd_10_variance8x16 = aom_highbd_10_variance8x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x16 = aom_highbd_10_variance8x16_avx2;
  }
  aom_highbd_10_variance8x32 = aom_highbd_10_variance8x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x32 = aom_highbd_10_variance8x32_avx2;
  }
  aom_highbd_10_variance8x8 = aom_highbd_10_variance8x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x8 = aom_highbd_10_variance8x8_avx2;
  }
  aom_highbd_12_masked_sub_pixel_variance128x128 = aom_highbd_12_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance128x128 =
         aom_highbd_12_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance128x64 = aom_highbd_12_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance128x64 =
         aom_highbd_12_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x16 = aom_highbd_12_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x16 =
         aom_highbd_12_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x32 = aom_highbd_12_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x32 =
         aom_highbd_12_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x4 = aom_highbd_12_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x4 = aom_highbd_12_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x64 = aom_highbd_12_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x64 =
         aom_highbd_12_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x8 = aom_highbd_12_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x8 = aom_highbd_12_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x16 = aom_highbd_12_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x16 =
         aom_highbd_12_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x32 = aom_highbd_12_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x32 =
         aom_highbd_12_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x64 = aom_highbd_12_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x64 =
         aom_highbd_12_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x8 = aom_highbd_12_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x8 = aom_highbd_12_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x16 = aom_highbd_12_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x16 = aom_highbd_12_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x4 = aom_highbd_12_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x4 = aom_highbd_12_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x8 = aom_highbd_12_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x8 = aom_highbd_12_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x128 = aom_highbd_12_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x128 =
         aom_highbd_12_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x16 = aom_highbd_12_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x16 =
         aom_highbd_12_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x32 = aom_highbd_12_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x32 =
         aom_highbd_12_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x64 = aom_highbd_12_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x64 =
         aom_highbd_12_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x16 = aom_highbd_12_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x16 = aom_highbd_12_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x32 = aom_highbd_12_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x32 = aom_highbd_12_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x4 = aom_highbd_12_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x4 = aom_highbd_12_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x8 = aom_highbd_12_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x8 = aom_highbd_12_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_12_obmc_variance128x128 = aom_highbd_12_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance128x128 = aom_highbd_12_obmc_variance128x128_sse4_1;
  }
  aom_highbd_12_obmc_variance128x64 = aom_highbd_12_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance128x64 = aom_highbd_12_obmc_variance128x64_sse4_1;
  }
  aom_highbd_12_obmc_variance16x16 = aom_highbd_12_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x16 = aom_highbd_12_obmc_variance16x16_sse4_1;
  }
  aom_highbd_12_obmc_variance16x32 = aom_highbd_12_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x32 = aom_highbd_12_obmc_variance16x32_sse4_1;
  }
  aom_highbd_12_obmc_variance16x4 = aom_highbd_12_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x4 = aom_highbd_12_obmc_variance16x4_sse4_1;
  }
  aom_highbd_12_obmc_variance16x64 = aom_highbd_12_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x64 = aom_highbd_12_obmc_variance16x64_sse4_1;
  }
  aom_highbd_12_obmc_variance16x8 = aom_highbd_12_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x8 = aom_highbd_12_obmc_variance16x8_sse4_1;
  }
  aom_highbd_12_obmc_variance32x16 = aom_highbd_12_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x16 = aom_highbd_12_obmc_variance32x16_sse4_1;
  }
  aom_highbd_12_obmc_variance32x32 = aom_highbd_12_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x32 = aom_highbd_12_obmc_variance32x32_sse4_1;
  }
  aom_highbd_12_obmc_variance32x64 = aom_highbd_12_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x64 = aom_highbd_12_obmc_variance32x64_sse4_1;
  }
  aom_highbd_12_obmc_variance32x8 = aom_highbd_12_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x8 = aom_highbd_12_obmc_variance32x8_sse4_1;
  }
  aom_highbd_12_obmc_variance4x16 = aom_highbd_12_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x16 = aom_highbd_12_obmc_variance4x16_sse4_1;
  }
  aom_highbd_12_obmc_variance4x4 = aom_highbd_12_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x4 = aom_highbd_12_obmc_variance4x4_sse4_1;
  }
  aom_highbd_12_obmc_variance4x8 = aom_highbd_12_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x8 = aom_highbd_12_obmc_variance4x8_sse4_1;
  }
  aom_highbd_12_obmc_variance64x128 = aom_highbd_12_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x128 = aom_highbd_12_obmc_variance64x128_sse4_1;
  }
  aom_highbd_12_obmc_variance64x16 = aom_highbd_12_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x16 = aom_highbd_12_obmc_variance64x16_sse4_1;
  }
  aom_highbd_12_obmc_variance64x32 = aom_highbd_12_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x32 = aom_highbd_12_obmc_variance64x32_sse4_1;
  }
  aom_highbd_12_obmc_variance64x64 = aom_highbd_12_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x64 = aom_highbd_12_obmc_variance64x64_sse4_1;
  }
  aom_highbd_12_obmc_variance8x16 = aom_highbd_12_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x16 = aom_highbd_12_obmc_variance8x16_sse4_1;
  }
  aom_highbd_12_obmc_variance8x32 = aom_highbd_12_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x32 = aom_highbd_12_obmc_variance8x32_sse4_1;
  }
  aom_highbd_12_obmc_variance8x4 = aom_highbd_12_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x4 = aom_highbd_12_obmc_variance8x4_sse4_1;
  }
  aom_highbd_12_obmc_variance8x8 = aom_highbd_12_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x8 = aom_highbd_12_obmc_variance8x8_sse4_1;
  }
  aom_highbd_12_sub_pixel_avg_variance4x4 = aom_highbd_12_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_sub_pixel_avg_variance4x4 = aom_highbd_12_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_12_sub_pixel_variance4x4 = aom_highbd_12_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_sub_pixel_variance4x4 = aom_highbd_12_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_12_variance4x4 = aom_highbd_12_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_variance4x4 = aom_highbd_12_variance4x4_sse4_1;
  }
  aom_highbd_8_masked_sub_pixel_variance128x128 = aom_highbd_8_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance128x128 =
         aom_highbd_8_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance128x64 = aom_highbd_8_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance128x64 =
         aom_highbd_8_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x16 = aom_highbd_8_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x16 = aom_highbd_8_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x32 = aom_highbd_8_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x32 = aom_highbd_8_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x4 = aom_highbd_8_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x4 = aom_highbd_8_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x64 = aom_highbd_8_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x64 = aom_highbd_8_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x8 = aom_highbd_8_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x8 = aom_highbd_8_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x16 = aom_highbd_8_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x16 = aom_highbd_8_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x32 = aom_highbd_8_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x32 = aom_highbd_8_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x64 = aom_highbd_8_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x64 = aom_highbd_8_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x8 = aom_highbd_8_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x8 = aom_highbd_8_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x16 = aom_highbd_8_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x16 = aom_highbd_8_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x4 = aom_highbd_8_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x4 = aom_highbd_8_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x8 = aom_highbd_8_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x8 = aom_highbd_8_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x128 = aom_highbd_8_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x128 =
         aom_highbd_8_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x16 = aom_highbd_8_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x16 = aom_highbd_8_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x32 = aom_highbd_8_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x32 = aom_highbd_8_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x64 = aom_highbd_8_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x64 = aom_highbd_8_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x16 = aom_highbd_8_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x16 = aom_highbd_8_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x32 = aom_highbd_8_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x32 = aom_highbd_8_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x4 = aom_highbd_8_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x4 = aom_highbd_8_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x8 = aom_highbd_8_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x8 = aom_highbd_8_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_8_obmc_variance128x128 = aom_highbd_8_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance128x128 = aom_highbd_8_obmc_variance128x128_sse4_1;
  }
  aom_highbd_8_obmc_variance128x64 = aom_highbd_8_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance128x64 = aom_highbd_8_obmc_variance128x64_sse4_1;
  }
  aom_highbd_8_obmc_variance16x16 = aom_highbd_8_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x16 = aom_highbd_8_obmc_variance16x16_sse4_1;
  }
  aom_highbd_8_obmc_variance16x32 = aom_highbd_8_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x32 = aom_highbd_8_obmc_variance16x32_sse4_1;
  }
  aom_highbd_8_obmc_variance16x4 = aom_highbd_8_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x4 = aom_highbd_8_obmc_variance16x4_sse4_1;
  }
  aom_highbd_8_obmc_variance16x64 = aom_highbd_8_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x64 = aom_highbd_8_obmc_variance16x64_sse4_1;
  }
  aom_highbd_8_obmc_variance16x8 = aom_highbd_8_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x8 = aom_highbd_8_obmc_variance16x8_sse4_1;
  }
  aom_highbd_8_obmc_variance32x16 = aom_highbd_8_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x16 = aom_highbd_8_obmc_variance32x16_sse4_1;
  }
  aom_highbd_8_obmc_variance32x32 = aom_highbd_8_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x32 = aom_highbd_8_obmc_variance32x32_sse4_1;
  }
  aom_highbd_8_obmc_variance32x64 = aom_highbd_8_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x64 = aom_highbd_8_obmc_variance32x64_sse4_1;
  }
  aom_highbd_8_obmc_variance32x8 = aom_highbd_8_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x8 = aom_highbd_8_obmc_variance32x8_sse4_1;
  }
  aom_highbd_8_obmc_variance4x16 = aom_highbd_8_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x16 = aom_highbd_8_obmc_variance4x16_sse4_1;
  }
  aom_highbd_8_obmc_variance4x4 = aom_highbd_8_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x4 = aom_highbd_8_obmc_variance4x4_sse4_1;
  }
  aom_highbd_8_obmc_variance4x8 = aom_highbd_8_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x8 = aom_highbd_8_obmc_variance4x8_sse4_1;
  }
  aom_highbd_8_obmc_variance64x128 = aom_highbd_8_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x128 = aom_highbd_8_obmc_variance64x128_sse4_1;
  }
  aom_highbd_8_obmc_variance64x16 = aom_highbd_8_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x16 = aom_highbd_8_obmc_variance64x16_sse4_1;
  }
  aom_highbd_8_obmc_variance64x32 = aom_highbd_8_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x32 = aom_highbd_8_obmc_variance64x32_sse4_1;
  }
  aom_highbd_8_obmc_variance64x64 = aom_highbd_8_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x64 = aom_highbd_8_obmc_variance64x64_sse4_1;
  }
  aom_highbd_8_obmc_variance8x16 = aom_highbd_8_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x16 = aom_highbd_8_obmc_variance8x16_sse4_1;
  }
  aom_highbd_8_obmc_variance8x32 = aom_highbd_8_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x32 = aom_highbd_8_obmc_variance8x32_sse4_1;
  }
  aom_highbd_8_obmc_variance8x4 = aom_highbd_8_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x4 = aom_highbd_8_obmc_variance8x4_sse4_1;
  }
  aom_highbd_8_obmc_variance8x8 = aom_highbd_8_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x8 = aom_highbd_8_obmc_variance8x8_sse4_1;
  }
  aom_highbd_8_sub_pixel_avg_variance4x4 = aom_highbd_8_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_sub_pixel_avg_variance4x4 = aom_highbd_8_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_8_sub_pixel_variance4x4 = aom_highbd_8_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_sub_pixel_variance4x4 = aom_highbd_8_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_8_variance4x4 = aom_highbd_8_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_variance4x4 = aom_highbd_8_variance4x4_sse4_1;
  }
  aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_avx2;
  }
  aom_highbd_blend_a64_hmask = aom_highbd_blend_a64_hmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_hmask = aom_highbd_blend_a64_hmask_sse4_1;
  }
  aom_highbd_blend_a64_mask = aom_highbd_blend_a64_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_mask = aom_highbd_blend_a64_mask_sse4_1;
  }
  aom_highbd_blend_a64_vmask = aom_highbd_blend_a64_vmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_vmask = aom_highbd_blend_a64_vmask_sse4_1;
  }
  aom_highbd_comp_mask_pred = aom_highbd_comp_mask_pred_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_comp_mask_pred = aom_highbd_comp_mask_pred_avx2;
  }
  aom_highbd_convolve8_horiz = aom_highbd_convolve8_horiz_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve8_horiz = aom_highbd_convolve8_horiz_avx2;
  }
  aom_highbd_convolve8_vert = aom_highbd_convolve8_vert_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve8_vert = aom_highbd_convolve8_vert_avx2;
  }
  aom_highbd_convolve_copy = aom_highbd_convolve_copy_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve_copy = aom_highbd_convolve_copy_avx2;
  }
  aom_highbd_hadamard_16x16 = aom_highbd_hadamard_16x16_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_16x16 = aom_highbd_hadamard_16x16_avx2;
  }
  aom_highbd_hadamard_32x32 = aom_highbd_hadamard_32x32_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_32x32 = aom_highbd_hadamard_32x32_avx2;
  }
  aom_highbd_hadamard_8x8 = aom_highbd_hadamard_8x8_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_8x8 = aom_highbd_hadamard_8x8_avx2;
  }
  aom_highbd_lpf_horizontal_14_dual = aom_highbd_lpf_horizontal_14_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_14_dual = aom_highbd_lpf_horizontal_14_dual_avx2;
  }
  aom_highbd_lpf_horizontal_4_dual = aom_highbd_lpf_horizontal_4_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_4_dual = aom_highbd_lpf_horizontal_4_dual_avx2;
  }
  aom_highbd_lpf_horizontal_8_dual = aom_highbd_lpf_horizontal_8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_8_dual = aom_highbd_lpf_horizontal_8_dual_avx2;
  }
  aom_highbd_lpf_vertical_14_dual = aom_highbd_lpf_vertical_14_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_14_dual = aom_highbd_lpf_vertical_14_dual_avx2;
  }
  aom_highbd_lpf_vertical_4_dual = aom_highbd_lpf_vertical_4_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_4_dual = aom_highbd_lpf_vertical_4_dual_avx2;
  }
  aom_highbd_lpf_vertical_8_dual = aom_highbd_lpf_vertical_8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_8_dual = aom_highbd_lpf_vertical_8_dual_avx2;
  }
  aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_avx2;
  }
  aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_avx2;
  }
  aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_avx2;
  }
  aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_avx2;
  }
  aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_avx2;
  }
  aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_avx2;
  }
  aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_avx2;
  }
  aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_avx2;
  }
  aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_avx2;
  }
  aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_avx2;
  }
  aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_avx2;
  }
  aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_avx2;
  }
  aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_avx2;
  }
  aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_avx2;
  }
  aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_avx2;
  }
  aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_avx2;
  }
  aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_avx2;
  }
  aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_avx2;
  }
  aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_avx2;
  }
  aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_avx2;
  }
  aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_avx2;
  }
  aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_avx2;
  }
  aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_avx2;
  }
  aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_avx2;
  }
  aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_avx2;
  }
  aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_avx2;
  }
  aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_avx2;
  }
  aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_avx2;
  }
  aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_avx2;
  }
  aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_avx2;
  }
  aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_avx2;
  }
  aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_avx2;
  }
  aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_avx2;
  }
  aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_avx2;
  }
  aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_avx2;
  }
  aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_avx2;
  }
  aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_avx2;
  }
  aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_avx2;
  }
  aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_avx2;
  }
  aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_avx2;
  }
  aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_avx2;
  }
  aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_avx2;
  }
  aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_avx2;
  }
  aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_avx2;
  }
  aom_highbd_quantize_b = aom_highbd_quantize_b_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b = aom_highbd_quantize_b_avx2;
  }
  aom_highbd_quantize_b_32x32 = aom_highbd_quantize_b_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_32x32 = aom_highbd_quantize_b_32x32_avx2;
  }
  aom_highbd_quantize_b_32x32_adaptive = aom_highbd_quantize_b_32x32_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_32x32_adaptive = aom_highbd_quantize_b_32x32_adaptive_avx2;
  }
  aom_highbd_quantize_b_64x64 = aom_highbd_quantize_b_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_64x64 = aom_highbd_quantize_b_64x64_avx2;
  }
  aom_highbd_quantize_b_adaptive = aom_highbd_quantize_b_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_adaptive = aom_highbd_quantize_b_adaptive_avx2;
  }
  aom_highbd_sad128x128 = aom_highbd_sad128x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128 = aom_highbd_sad128x128_avx2;
  }
  aom_highbd_sad128x128_avg = aom_highbd_sad128x128_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128_avg = aom_highbd_sad128x128_avg_avx2;
  }
  aom_highbd_sad128x128x3d = aom_highbd_sad128x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128x3d = aom_highbd_sad128x128x3d_avx2;
  }
  aom_highbd_sad128x128x4d = aom_highbd_sad128x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128x4d = aom_highbd_sad128x128x4d_avx2;
  }
  aom_highbd_sad128x64 = aom_highbd_sad128x64_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64 = aom_highbd_sad128x64_avx2;
  }
  aom_highbd_sad128x64_avg = aom_highbd_sad128x64_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64_avg = aom_highbd_sad128x64_avg_avx2;
  }
  aom_highbd_sad128x64x3d = aom_highbd_sad128x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64x3d = aom_highbd_sad128x64x3d_avx2;
  }
  aom_highbd_sad128x64x4d = aom_highbd_sad128x64x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64x4d = aom_highbd_sad128x64x4d_avx2;
  }
  aom_highbd_sad16x16 = aom_highbd_sad16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16 = aom_highbd_sad16x16_avx2;
  }
  aom_highbd_sad16x16_avg = aom_highbd_sad16x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16_avg = aom_highbd_sad16x16_avg_avx2;
  }
  aom_highbd_sad16x16x3d = aom_highbd_sad16x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16x3d = aom_highbd_sad16x16x3d_avx2;
  }
  aom_highbd_sad16x16x4d = aom_highbd_sad16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16x4d = aom_highbd_sad16x16x4d_avx2;
  }
  aom_highbd_sad16x32 = aom_highbd_sad16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32 = aom_highbd_sad16x32_avx2;
  }
  aom_highbd_sad16x32_avg = aom_highbd_sad16x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32_avg = aom_highbd_sad16x32_avg_avx2;
  }
  aom_highbd_sad16x32x3d = aom_highbd_sad16x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32x3d = aom_highbd_sad16x32x3d_avx2;
  }
  aom_highbd_sad16x32x4d = aom_highbd_sad16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32x4d = aom_highbd_sad16x32x4d_avx2;
  }
  aom_highbd_sad16x4 = aom_highbd_sad16x4_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4 = aom_highbd_sad16x4_avx2;
  }
  aom_highbd_sad16x4x3d = aom_highbd_sad16x4x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4x3d = aom_highbd_sad16x4x3d_avx2;
  }
  aom_highbd_sad16x4x4d = aom_highbd_sad16x4x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4x4d = aom_highbd_sad16x4x4d_avx2;
  }
  aom_highbd_sad16x64 = aom_highbd_sad16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64 = aom_highbd_sad16x64_avx2;
  }
  aom_highbd_sad16x64_avg = aom_highbd_sad16x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64_avg = aom_highbd_sad16x64_avg_avx2;
  }
  aom_highbd_sad16x64x3d = aom_highbd_sad16x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64x3d = aom_highbd_sad16x64x3d_avx2;
  }
  aom_highbd_sad16x64x4d = aom_highbd_sad16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64x4d = aom_highbd_sad16x64x4d_avx2;
  }
  aom_highbd_sad16x8 = aom_highbd_sad16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8 = aom_highbd_sad16x8_avx2;
  }
  aom_highbd_sad16x8_avg = aom_highbd_sad16x8_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8_avg = aom_highbd_sad16x8_avg_avx2;
  }
  aom_highbd_sad16x8x3d = aom_highbd_sad16x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8x3d = aom_highbd_sad16x8x3d_avx2;
  }
  aom_highbd_sad16x8x4d = aom_highbd_sad16x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8x4d = aom_highbd_sad16x8x4d_avx2;
  }
  aom_highbd_sad32x16 = aom_highbd_sad32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16 = aom_highbd_sad32x16_avx2;
  }
  aom_highbd_sad32x16_avg = aom_highbd_sad32x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16_avg = aom_highbd_sad32x16_avg_avx2;
  }
  aom_highbd_sad32x16x3d = aom_highbd_sad32x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16x3d = aom_highbd_sad32x16x3d_avx2;
  }
  aom_highbd_sad32x16x4d = aom_highbd_sad32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16x4d = aom_highbd_sad32x16x4d_avx2;
  }
  aom_highbd_sad32x32 = aom_highbd_sad32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32 = aom_highbd_sad32x32_avx2;
  }
  aom_highbd_sad32x32_avg = aom_highbd_sad32x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32_avg = aom_highbd_sad32x32_avg_avx2;
  }
  aom_highbd_sad32x32x3d = aom_highbd_sad32x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32x3d = aom_highbd_sad32x32x3d_avx2;
  }
  aom_highbd_sad32x32x4d = aom_highbd_sad32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32x4d = aom_highbd_sad32x32x4d_avx2;
  }
  aom_highbd_sad32x64 = aom_highbd_sad32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64 = aom_highbd_sad32x64_avx2;
  }
  aom_highbd_sad32x64_avg = aom_highbd_sad32x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64_avg = aom_highbd_sad32x64_avg_avx2;
  }
  aom_highbd_sad32x64x3d = aom_highbd_sad32x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64x3d = aom_highbd_sad32x64x3d_avx2;
  }
  aom_highbd_sad32x64x4d = aom_highbd_sad32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64x4d = aom_highbd_sad32x64x4d_avx2;
  }
  aom_highbd_sad32x8 = aom_highbd_sad32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8 = aom_highbd_sad32x8_avx2;
  }
  aom_highbd_sad32x8_avg = aom_highbd_sad32x8_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8_avg = aom_highbd_sad32x8_avg_avx2;
  }
  aom_highbd_sad32x8x3d = aom_highbd_sad32x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8x3d = aom_highbd_sad32x8x3d_avx2;
  }
  aom_highbd_sad32x8x4d = aom_highbd_sad32x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8x4d = aom_highbd_sad32x8x4d_avx2;
  }
  aom_highbd_sad64x128 = aom_highbd_sad64x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128 = aom_highbd_sad64x128_avx2;
  }
  aom_highbd_sad64x128_avg = aom_highbd_sad64x128_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128_avg = aom_highbd_sad64x128_avg_avx2;
  }
  aom_highbd_sad64x128x3d = aom_highbd_sad64x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128x3d = aom_highbd_sad64x128x3d_avx2;
  }
  aom_highbd_sad64x128x4d = aom_highbd_sad64x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128x4d = aom_highbd_sad64x128x4d_avx2;
  }
  aom_highbd_sad64x16 = aom_highbd_sad64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16 = aom_highbd_sad64x16_avx2;
  }
  aom_highbd_sad64x16_avg = aom_highbd_sad64x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16_avg = aom_highbd_sad64x16_avg_avx2;
  }
  aom_highbd_sad64x16x3d = aom_highbd_sad64x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16x3d = aom_highbd_sad64x16x3d_avx2;
  }
  aom_highbd_sad64x16x4d = aom_highbd_sad64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16x4d = aom_highbd_sad64x16x4d_avx2;
  }
  aom_highbd_sad64x32 = aom_highbd_sad64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32 = aom_highbd_sad64x32_avx2;
  }
  aom_highbd_sad64x32_avg = aom_highbd_sad64x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32_avg = aom_highbd_sad64x32_avg_avx2;
  }
  aom_highbd_sad64x32x3d = aom_highbd_sad64x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32x3d = aom_highbd_sad64x32x3d_avx2;
  }
  aom_highbd_sad64x32x4d = aom_highbd_sad64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32x4d = aom_highbd_sad64x32x4d_avx2;
  }
  aom_highbd_sad64x64 = aom_highbd_sad64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64 = aom_highbd_sad64x64_avx2;
  }
  aom_highbd_sad64x64_avg = aom_highbd_sad64x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64_avg = aom_highbd_sad64x64_avg_avx2;
  }
  aom_highbd_sad64x64x3d = aom_highbd_sad64x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64x3d = aom_highbd_sad64x64x3d_avx2;
  }
  aom_highbd_sad64x64x4d = aom_highbd_sad64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64x4d = aom_highbd_sad64x64x4d_avx2;
  }
  aom_highbd_sad_skip_128x128 = aom_highbd_sad_skip_128x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x128 = aom_highbd_sad_skip_128x128_avx2;
  }
  aom_highbd_sad_skip_128x128x4d = aom_highbd_sad_skip_128x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x128x4d = aom_highbd_sad_skip_128x128x4d_avx2;
  }
  aom_highbd_sad_skip_128x64 = aom_highbd_sad_skip_128x64_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x64 = aom_highbd_sad_skip_128x64_avx2;
  }
  aom_highbd_sad_skip_128x64x4d = aom_highbd_sad_skip_128x64x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x64x4d = aom_highbd_sad_skip_128x64x4d_avx2;
  }
  aom_highbd_sad_skip_16x16 = aom_highbd_sad_skip_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x16 = aom_highbd_sad_skip_16x16_avx2;
  }
  aom_highbd_sad_skip_16x16x4d = aom_highbd_sad_skip_16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x16x4d = aom_highbd_sad_skip_16x16x4d_avx2;
  }
  aom_highbd_sad_skip_16x32 = aom_highbd_sad_skip_16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x32 = aom_highbd_sad_skip_16x32_avx2;
  }
  aom_highbd_sad_skip_16x32x4d = aom_highbd_sad_skip_16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x32x4d = aom_highbd_sad_skip_16x32x4d_avx2;
  }
  aom_highbd_sad_skip_16x64 = aom_highbd_sad_skip_16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x64 = aom_highbd_sad_skip_16x64_avx2;
  }
  aom_highbd_sad_skip_16x64x4d = aom_highbd_sad_skip_16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x64x4d = aom_highbd_sad_skip_16x64x4d_avx2;
  }
  aom_highbd_sad_skip_32x16 = aom_highbd_sad_skip_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x16 = aom_highbd_sad_skip_32x16_avx2;
  }
  aom_highbd_sad_skip_32x16x4d = aom_highbd_sad_skip_32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x16x4d = aom_highbd_sad_skip_32x16x4d_avx2;
  }
  aom_highbd_sad_skip_32x32 = aom_highbd_sad_skip_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x32 = aom_highbd_sad_skip_32x32_avx2;
  }
  aom_highbd_sad_skip_32x32x4d = aom_highbd_sad_skip_32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x32x4d = aom_highbd_sad_skip_32x32x4d_avx2;
  }
  aom_highbd_sad_skip_32x64 = aom_highbd_sad_skip_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x64 = aom_highbd_sad_skip_32x64_avx2;
  }
  aom_highbd_sad_skip_32x64x4d = aom_highbd_sad_skip_32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x64x4d = aom_highbd_sad_skip_32x64x4d_avx2;
  }
  aom_highbd_sad_skip_64x128 = aom_highbd_sad_skip_64x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x128 = aom_highbd_sad_skip_64x128_avx2;
  }
  aom_highbd_sad_skip_64x128x4d = aom_highbd_sad_skip_64x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x128x4d = aom_highbd_sad_skip_64x128x4d_avx2;
  }
  aom_highbd_sad_skip_64x16 = aom_highbd_sad_skip_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x16 = aom_highbd_sad_skip_64x16_avx2;
  }
  aom_highbd_sad_skip_64x16x4d = aom_highbd_sad_skip_64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x16x4d = aom_highbd_sad_skip_64x16x4d_avx2;
  }
  aom_highbd_sad_skip_64x32 = aom_highbd_sad_skip_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x32 = aom_highbd_sad_skip_64x32_avx2;
  }
  aom_highbd_sad_skip_64x32x4d = aom_highbd_sad_skip_64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x32x4d = aom_highbd_sad_skip_64x32x4d_avx2;
  }
  aom_highbd_sad_skip_64x64 = aom_highbd_sad_skip_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x64 = aom_highbd_sad_skip_64x64_avx2;
  }
  aom_highbd_sad_skip_64x64x4d = aom_highbd_sad_skip_64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x64x4d = aom_highbd_sad_skip_64x64x4d_avx2;
  }
  aom_highbd_sse = aom_highbd_sse_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_sse = aom_highbd_sse_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sse = aom_highbd_sse_avx2;
  }
  aom_ifft16x16_float = aom_ifft16x16_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft16x16_float = aom_ifft16x16_float_avx2;
  }
  aom_ifft32x32_float = aom_ifft32x32_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft32x32_float = aom_ifft32x32_float_avx2;
  }
  aom_ifft8x8_float = aom_ifft8x8_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft8x8_float = aom_ifft8x8_float_avx2;
  }
  aom_int_pro_col = aom_int_pro_col_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_int_pro_col = aom_int_pro_col_avx2;
  }
  aom_int_pro_row = aom_int_pro_row_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_int_pro_row = aom_int_pro_row_avx2;
  }
  aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_avx2;
  }
  aom_lpf_horizontal_14_quad = aom_lpf_horizontal_14_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_14_quad = aom_lpf_horizontal_14_quad_avx2;
  }
  aom_lpf_horizontal_6_quad = aom_lpf_horizontal_6_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_6_quad = aom_lpf_horizontal_6_quad_avx2;
  }
  aom_lpf_horizontal_8_quad = aom_lpf_horizontal_8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_8_quad = aom_lpf_horizontal_8_quad_avx2;
  }
  aom_lpf_vertical_14_quad = aom_lpf_vertical_14_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_vertical_14_quad = aom_lpf_vertical_14_quad_avx2;
  }
  aom_masked_sad128x128 = aom_masked_sad128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad128x128 = aom_masked_sad128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad128x128 = aom_masked_sad128x128_avx2;
  }
  aom_masked_sad128x64 = aom_masked_sad128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad128x64 = aom_masked_sad128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad128x64 = aom_masked_sad128x64_avx2;
  }
  aom_masked_sad16x16 = aom_masked_sad16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x16 = aom_masked_sad16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x16 = aom_masked_sad16x16_avx2;
  }
  aom_masked_sad16x32 = aom_masked_sad16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x32 = aom_masked_sad16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x32 = aom_masked_sad16x32_avx2;
  }
  aom_masked_sad16x4 = aom_masked_sad16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x4 = aom_masked_sad16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x4 = aom_masked_sad16x4_avx2;
  }
  aom_masked_sad16x64 = aom_masked_sad16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x64 = aom_masked_sad16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x64 = aom_masked_sad16x64_avx2;
  }
  aom_masked_sad16x8 = aom_masked_sad16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x8 = aom_masked_sad16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x8 = aom_masked_sad16x8_avx2;
  }
  aom_masked_sad32x16 = aom_masked_sad32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x16 = aom_masked_sad32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x16 = aom_masked_sad32x16_avx2;
  }
  aom_masked_sad32x32 = aom_masked_sad32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x32 = aom_masked_sad32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x32 = aom_masked_sad32x32_avx2;
  }
  aom_masked_sad32x64 = aom_masked_sad32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x64 = aom_masked_sad32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x64 = aom_masked_sad32x64_avx2;
  }
  aom_masked_sad32x8 = aom_masked_sad32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x8 = aom_masked_sad32x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x8 = aom_masked_sad32x8_avx2;
  }
  aom_masked_sad4x16 = aom_masked_sad4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x16 = aom_masked_sad4x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x16 = aom_masked_sad4x16_avx2;
  }
  aom_masked_sad4x4 = aom_masked_sad4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x4 = aom_masked_sad4x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x4 = aom_masked_sad4x4_avx2;
  }
  aom_masked_sad4x8 = aom_masked_sad4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x8 = aom_masked_sad4x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x8 = aom_masked_sad4x8_avx2;
  }
  aom_masked_sad64x128 = aom_masked_sad64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x128 = aom_masked_sad64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x128 = aom_masked_sad64x128_avx2;
  }
  aom_masked_sad64x16 = aom_masked_sad64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x16 = aom_masked_sad64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x16 = aom_masked_sad64x16_avx2;
  }
  aom_masked_sad64x32 = aom_masked_sad64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x32 = aom_masked_sad64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x32 = aom_masked_sad64x32_avx2;
  }
  aom_masked_sad64x64 = aom_masked_sad64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x64 = aom_masked_sad64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x64 = aom_masked_sad64x64_avx2;
  }
  aom_masked_sad8x16 = aom_masked_sad8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x16 = aom_masked_sad8x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x16 = aom_masked_sad8x16_avx2;
  }
  aom_masked_sad8x32 = aom_masked_sad8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x32 = aom_masked_sad8x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x32 = aom_masked_sad8x32_avx2;
  }
  aom_masked_sad8x4 = aom_masked_sad8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x4 = aom_masked_sad8x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x4 = aom_masked_sad8x4_avx2;
  }
  aom_masked_sad8x8 = aom_masked_sad8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x8 = aom_masked_sad8x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x8 = aom_masked_sad8x8_avx2;
  }
  aom_masked_sub_pixel_variance128x128 = aom_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance128x128 = aom_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_masked_sub_pixel_variance128x64 = aom_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance128x64 = aom_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_masked_sub_pixel_variance16x16 = aom_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x16 = aom_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_masked_sub_pixel_variance16x32 = aom_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x32 = aom_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_masked_sub_pixel_variance16x4 = aom_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x4 = aom_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_masked_sub_pixel_variance16x64 = aom_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x64 = aom_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_masked_sub_pixel_variance16x8 = aom_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x8 = aom_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_masked_sub_pixel_variance32x16 = aom_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x16 = aom_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_masked_sub_pixel_variance32x32 = aom_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x32 = aom_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_masked_sub_pixel_variance32x64 = aom_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x64 = aom_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_masked_sub_pixel_variance32x8 = aom_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x8 = aom_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_masked_sub_pixel_variance4x16 = aom_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x16 = aom_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_masked_sub_pixel_variance4x4 = aom_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x4 = aom_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_masked_sub_pixel_variance4x8 = aom_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x8 = aom_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_masked_sub_pixel_variance64x128 = aom_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x128 = aom_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_masked_sub_pixel_variance64x16 = aom_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x16 = aom_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_masked_sub_pixel_variance64x32 = aom_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x32 = aom_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_masked_sub_pixel_variance64x64 = aom_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x64 = aom_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_masked_sub_pixel_variance8x16 = aom_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x16 = aom_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_masked_sub_pixel_variance8x32 = aom_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x32 = aom_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_masked_sub_pixel_variance8x4 = aom_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x4 = aom_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_masked_sub_pixel_variance8x8 = aom_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x8 = aom_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_mse16x16 = aom_mse16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse16x16 = aom_mse16x16_avx2;
  }
  aom_mse_16xh_16bit = aom_mse_16xh_16bit_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_16xh_16bit = aom_mse_16xh_16bit_avx2;
  }
  aom_mse_wxh_16bit = aom_mse_wxh_16bit_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_wxh_16bit = aom_mse_wxh_16bit_avx2;
  }
  aom_mse_wxh_16bit_highbd = aom_mse_wxh_16bit_highbd_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_wxh_16bit_highbd = aom_mse_wxh_16bit_highbd_avx2;
  }
  aom_obmc_sad128x128 = aom_obmc_sad128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad128x128 = aom_obmc_sad128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad128x128 = aom_obmc_sad128x128_avx2;
  }
  aom_obmc_sad128x64 = aom_obmc_sad128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad128x64 = aom_obmc_sad128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad128x64 = aom_obmc_sad128x64_avx2;
  }
  aom_obmc_sad16x16 = aom_obmc_sad16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x16 = aom_obmc_sad16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x16 = aom_obmc_sad16x16_avx2;
  }
  aom_obmc_sad16x32 = aom_obmc_sad16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x32 = aom_obmc_sad16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x32 = aom_obmc_sad16x32_avx2;
  }
  aom_obmc_sad16x4 = aom_obmc_sad16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x4 = aom_obmc_sad16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x4 = aom_obmc_sad16x4_avx2;
  }
  aom_obmc_sad16x64 = aom_obmc_sad16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x64 = aom_obmc_sad16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x64 = aom_obmc_sad16x64_avx2;
  }
  aom_obmc_sad16x8 = aom_obmc_sad16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x8 = aom_obmc_sad16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x8 = aom_obmc_sad16x8_avx2;
  }
  aom_obmc_sad32x16 = aom_obmc_sad32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x16 = aom_obmc_sad32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x16 = aom_obmc_sad32x16_avx2;
  }
  aom_obmc_sad32x32 = aom_obmc_sad32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x32 = aom_obmc_sad32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x32 = aom_obmc_sad32x32_avx2;
  }
  aom_obmc_sad32x64 = aom_obmc_sad32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x64 = aom_obmc_sad32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x64 = aom_obmc_sad32x64_avx2;
  }
  aom_obmc_sad32x8 = aom_obmc_sad32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x8 = aom_obmc_sad32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x8 = aom_obmc_sad32x8_avx2;
  }
  aom_obmc_sad4x16 = aom_obmc_sad4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x16 = aom_obmc_sad4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x16 = aom_obmc_sad4x16_avx2;
  }
  aom_obmc_sad4x4 = aom_obmc_sad4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x4 = aom_obmc_sad4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x4 = aom_obmc_sad4x4_avx2;
  }
  aom_obmc_sad4x8 = aom_obmc_sad4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x8 = aom_obmc_sad4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x8 = aom_obmc_sad4x8_avx2;
  }
  aom_obmc_sad64x128 = aom_obmc_sad64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x128 = aom_obmc_sad64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x128 = aom_obmc_sad64x128_avx2;
  }
  aom_obmc_sad64x16 = aom_obmc_sad64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x16 = aom_obmc_sad64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x16 = aom_obmc_sad64x16_avx2;
  }
  aom_obmc_sad64x32 = aom_obmc_sad64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x32 = aom_obmc_sad64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x32 = aom_obmc_sad64x32_avx2;
  }
  aom_obmc_sad64x64 = aom_obmc_sad64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x64 = aom_obmc_sad64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x64 = aom_obmc_sad64x64_avx2;
  }
  aom_obmc_sad8x16 = aom_obmc_sad8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x16 = aom_obmc_sad8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x16 = aom_obmc_sad8x16_avx2;
  }
  aom_obmc_sad8x32 = aom_obmc_sad8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x32 = aom_obmc_sad8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x32 = aom_obmc_sad8x32_avx2;
  }
  aom_obmc_sad8x4 = aom_obmc_sad8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x4 = aom_obmc_sad8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x4 = aom_obmc_sad8x4_avx2;
  }
  aom_obmc_sad8x8 = aom_obmc_sad8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x8 = aom_obmc_sad8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x8 = aom_obmc_sad8x8_avx2;
  }
  aom_obmc_sub_pixel_variance128x128 = aom_obmc_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance128x128 = aom_obmc_sub_pixel_variance128x128_sse4_1;
  }
  aom_obmc_sub_pixel_variance128x64 = aom_obmc_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance128x64 = aom_obmc_sub_pixel_variance128x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x16 = aom_obmc_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x16 = aom_obmc_sub_pixel_variance16x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x32 = aom_obmc_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x32 = aom_obmc_sub_pixel_variance16x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x4 = aom_obmc_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x4 = aom_obmc_sub_pixel_variance16x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x64 = aom_obmc_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x64 = aom_obmc_sub_pixel_variance16x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x8 = aom_obmc_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x8 = aom_obmc_sub_pixel_variance16x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x16 = aom_obmc_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x16 = aom_obmc_sub_pixel_variance32x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x32 = aom_obmc_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x32 = aom_obmc_sub_pixel_variance32x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x64 = aom_obmc_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x64 = aom_obmc_sub_pixel_variance32x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x8 = aom_obmc_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x8 = aom_obmc_sub_pixel_variance32x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x16 = aom_obmc_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x16 = aom_obmc_sub_pixel_variance4x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x4 = aom_obmc_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x4 = aom_obmc_sub_pixel_variance4x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x8 = aom_obmc_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x8 = aom_obmc_sub_pixel_variance4x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x128 = aom_obmc_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x128 = aom_obmc_sub_pixel_variance64x128_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x16 = aom_obmc_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x16 = aom_obmc_sub_pixel_variance64x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x32 = aom_obmc_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x32 = aom_obmc_sub_pixel_variance64x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x64 = aom_obmc_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x64 = aom_obmc_sub_pixel_variance64x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x16 = aom_obmc_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x16 = aom_obmc_sub_pixel_variance8x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x32 = aom_obmc_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x32 = aom_obmc_sub_pixel_variance8x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x4 = aom_obmc_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x4 = aom_obmc_sub_pixel_variance8x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x8 = aom_obmc_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x8 = aom_obmc_sub_pixel_variance8x8_sse4_1;
  }
  aom_obmc_variance128x128 = aom_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance128x128 = aom_obmc_variance128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance128x128 = aom_obmc_variance128x128_avx2;
  }
  aom_obmc_variance128x64 = aom_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance128x64 = aom_obmc_variance128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance128x64 = aom_obmc_variance128x64_avx2;
  }
  aom_obmc_variance16x16 = aom_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x16 = aom_obmc_variance16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x16 = aom_obmc_variance16x16_avx2;
  }
  aom_obmc_variance16x32 = aom_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x32 = aom_obmc_variance16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x32 = aom_obmc_variance16x32_avx2;
  }
  aom_obmc_variance16x4 = aom_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x4 = aom_obmc_variance16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x4 = aom_obmc_variance16x4_avx2;
  }
  aom_obmc_variance16x64 = aom_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x64 = aom_obmc_variance16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x64 = aom_obmc_variance16x64_avx2;
  }
  aom_obmc_variance16x8 = aom_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x8 = aom_obmc_variance16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x8 = aom_obmc_variance16x8_avx2;
  }
  aom_obmc_variance32x16 = aom_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x16 = aom_obmc_variance32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x16 = aom_obmc_variance32x16_avx2;
  }
  aom_obmc_variance32x32 = aom_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x32 = aom_obmc_variance32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x32 = aom_obmc_variance32x32_avx2;
  }
  aom_obmc_variance32x64 = aom_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x64 = aom_obmc_variance32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x64 = aom_obmc_variance32x64_avx2;
  }
  aom_obmc_variance32x8 = aom_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x8 = aom_obmc_variance32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x8 = aom_obmc_variance32x8_avx2;
  }
  aom_obmc_variance4x16 = aom_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x16 = aom_obmc_variance4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x16 = aom_obmc_variance4x16_avx2;
  }
  aom_obmc_variance4x4 = aom_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x4 = aom_obmc_variance4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x4 = aom_obmc_variance4x4_avx2;
  }
  aom_obmc_variance4x8 = aom_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x8 = aom_obmc_variance4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x8 = aom_obmc_variance4x8_avx2;
  }
  aom_obmc_variance64x128 = aom_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x128 = aom_obmc_variance64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x128 = aom_obmc_variance64x128_avx2;
  }
  aom_obmc_variance64x16 = aom_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x16 = aom_obmc_variance64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x16 = aom_obmc_variance64x16_avx2;
  }
  aom_obmc_variance64x32 = aom_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x32 = aom_obmc_variance64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x32 = aom_obmc_variance64x32_avx2;
  }
  aom_obmc_variance64x64 = aom_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x64 = aom_obmc_variance64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x64 = aom_obmc_variance64x64_avx2;
  }
  aom_obmc_variance8x16 = aom_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x16 = aom_obmc_variance8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x16 = aom_obmc_variance8x16_avx2;
  }
  aom_obmc_variance8x32 = aom_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x32 = aom_obmc_variance8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x32 = aom_obmc_variance8x32_avx2;
  }
  aom_obmc_variance8x4 = aom_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x4 = aom_obmc_variance8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x4 = aom_obmc_variance8x4_avx2;
  }
  aom_obmc_variance8x8 = aom_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x8 = aom_obmc_variance8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x8 = aom_obmc_variance8x8_avx2;
  }
  aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_avx2;
  }
  aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_avx2;
  }
  aom_paeth_predictor_16x4 = aom_paeth_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x4 = aom_paeth_predictor_16x4_ssse3;
  }
  aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_avx2;
  }
  aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_avx2;
  }
  aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_avx2;
  }
  aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_avx2;
  }
  aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_avx2;
  }
  aom_paeth_predictor_32x8 = aom_paeth_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x8 = aom_paeth_predictor_32x8_ssse3;
  }
  aom_paeth_predictor_4x16 = aom_paeth_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x16 = aom_paeth_predictor_4x16_ssse3;
  }
  aom_paeth_predictor_4x4 = aom_paeth_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x4 = aom_paeth_predictor_4x4_ssse3;
  }
  aom_paeth_predictor_4x8 = aom_paeth_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x8 = aom_paeth_predictor_4x8_ssse3;
  }
  aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_avx2;
  }
  aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_avx2;
  }
  aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_avx2;
  }
  aom_paeth_predictor_8x16 = aom_paeth_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x16 = aom_paeth_predictor_8x16_ssse3;
  }
  aom_paeth_predictor_8x32 = aom_paeth_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x32 = aom_paeth_predictor_8x32_ssse3;
  }
  aom_paeth_predictor_8x4 = aom_paeth_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x4 = aom_paeth_predictor_8x4_ssse3;
  }
  aom_paeth_predictor_8x8 = aom_paeth_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x8 = aom_paeth_predictor_8x8_ssse3;
  }
  aom_quantize_b = aom_quantize_b_sse2;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b = aom_quantize_b_ssse3;
  }
  if ((uVar1 & 0x40) != 0) {
    aom_quantize_b = aom_quantize_b_avx;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b = aom_quantize_b_avx2;
  }
  aom_quantize_b_32x32 = aom_quantize_b_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_ssse3;
  }
  if ((uVar1 & 0x40) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_avx;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_avx2;
  }
  aom_quantize_b_64x64 = aom_quantize_b_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b_64x64 = aom_quantize_b_64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_64x64 = aom_quantize_b_64x64_avx2;
  }
  aom_quantize_b_adaptive = aom_quantize_b_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_adaptive = aom_quantize_b_adaptive_avx2;
  }
  aom_sad128x128 = aom_sad128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128 = aom_sad128x128_avx2;
  }
  aom_sad128x128_avg = aom_sad128x128_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128_avg = aom_sad128x128_avg_avx2;
  }
  aom_sad128x128x3d = aom_sad128x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128x3d = aom_sad128x128x3d_avx2;
  }
  aom_sad128x128x4d = aom_sad128x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128x4d = aom_sad128x128x4d_avx2;
  }
  aom_sad128x64 = aom_sad128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64 = aom_sad128x64_avx2;
  }
  aom_sad128x64_avg = aom_sad128x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64_avg = aom_sad128x64_avg_avx2;
  }
  aom_sad128x64x3d = aom_sad128x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64x3d = aom_sad128x64x3d_avx2;
  }
  aom_sad128x64x4d = aom_sad128x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64x4d = aom_sad128x64x4d_avx2;
  }
  aom_sad16x16x3d = aom_sad16x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x16x3d = aom_sad16x16x3d_avx2;
  }
  aom_sad16x16x4d = aom_sad16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x16x4d = aom_sad16x16x4d_avx2;
  }
  aom_sad16x32x3d = aom_sad16x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x32x3d = aom_sad16x32x3d_avx2;
  }
  aom_sad16x32x4d = aom_sad16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x32x4d = aom_sad16x32x4d_avx2;
  }
  aom_sad16x4x3d = aom_sad16x4x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x4x3d = aom_sad16x4x3d_avx2;
  }
  aom_sad16x4x4d = aom_sad16x4x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x4x4d = aom_sad16x4x4d_avx2;
  }
  aom_sad16x64x3d = aom_sad16x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x64x3d = aom_sad16x64x3d_avx2;
  }
  aom_sad16x64x4d = aom_sad16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x64x4d = aom_sad16x64x4d_avx2;
  }
  aom_sad16x8x3d = aom_sad16x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x8x3d = aom_sad16x8x3d_avx2;
  }
  aom_sad16x8x4d = aom_sad16x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x8x4d = aom_sad16x8x4d_avx2;
  }
  aom_sad32x16 = aom_sad32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16 = aom_sad32x16_avx2;
  }
  aom_sad32x16_avg = aom_sad32x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16_avg = aom_sad32x16_avg_avx2;
  }
  aom_sad32x16x3d = aom_sad32x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16x3d = aom_sad32x16x3d_avx2;
  }
  aom_sad32x16x4d = aom_sad32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16x4d = aom_sad32x16x4d_avx2;
  }
  aom_sad32x32 = aom_sad32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32 = aom_sad32x32_avx2;
  }
  aom_sad32x32_avg = aom_sad32x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32_avg = aom_sad32x32_avg_avx2;
  }
  aom_sad32x32x3d = aom_sad32x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32x3d = aom_sad32x32x3d_avx2;
  }
  aom_sad32x32x4d = aom_sad32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32x4d = aom_sad32x32x4d_avx2;
  }
  aom_sad32x64 = aom_sad32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64 = aom_sad32x64_avx2;
  }
  aom_sad32x64_avg = aom_sad32x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64_avg = aom_sad32x64_avg_avx2;
  }
  aom_sad32x64x3d = aom_sad32x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64x3d = aom_sad32x64x3d_avx2;
  }
  aom_sad32x64x4d = aom_sad32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64x4d = aom_sad32x64x4d_avx2;
  }
  aom_sad32x8x3d = aom_sad32x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x8x3d = aom_sad32x8x3d_avx2;
  }
  aom_sad32x8x4d = aom_sad32x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x8x4d = aom_sad32x8x4d_avx2;
  }
  aom_sad64x128 = aom_sad64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128 = aom_sad64x128_avx2;
  }
  aom_sad64x128_avg = aom_sad64x128_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128_avg = aom_sad64x128_avg_avx2;
  }
  aom_sad64x128x3d = aom_sad64x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128x3d = aom_sad64x128x3d_avx2;
  }
  aom_sad64x128x4d = aom_sad64x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128x4d = aom_sad64x128x4d_avx2;
  }
  aom_sad64x16x3d = aom_sad64x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x16x3d = aom_sad64x16x3d_avx2;
  }
  aom_sad64x16x4d = aom_sad64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x16x4d = aom_sad64x16x4d_avx2;
  }
  aom_sad64x32 = aom_sad64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32 = aom_sad64x32_avx2;
  }
  aom_sad64x32_avg = aom_sad64x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32_avg = aom_sad64x32_avg_avx2;
  }
  aom_sad64x32x3d = aom_sad64x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32x3d = aom_sad64x32x3d_avx2;
  }
  aom_sad64x32x4d = aom_sad64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32x4d = aom_sad64x32x4d_avx2;
  }
  aom_sad64x64 = aom_sad64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64 = aom_sad64x64_avx2;
  }
  aom_sad64x64_avg = aom_sad64x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64_avg = aom_sad64x64_avg_avx2;
  }
  aom_sad64x64x3d = aom_sad64x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64x3d = aom_sad64x64x3d_avx2;
  }
  aom_sad64x64x4d = aom_sad64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64x4d = aom_sad64x64x4d_avx2;
  }
  aom_sad_skip_128x128 = aom_sad_skip_128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x128 = aom_sad_skip_128x128_avx2;
  }
  aom_sad_skip_128x128x4d = aom_sad_skip_128x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x128x4d = aom_sad_skip_128x128x4d_avx2;
  }
  aom_sad_skip_128x64 = aom_sad_skip_128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x64 = aom_sad_skip_128x64_avx2;
  }
  aom_sad_skip_128x64x4d = aom_sad_skip_128x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x64x4d = aom_sad_skip_128x64x4d_avx2;
  }
  aom_sad_skip_16x16x4d = aom_sad_skip_16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x16x4d = aom_sad_skip_16x16x4d_avx2;
  }
  aom_sad_skip_16x32x4d = aom_sad_skip_16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x32x4d = aom_sad_skip_16x32x4d_avx2;
  }
  aom_sad_skip_16x64x4d = aom_sad_skip_16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x64x4d = aom_sad_skip_16x64x4d_avx2;
  }
  aom_sad_skip_32x16 = aom_sad_skip_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x16 = aom_sad_skip_32x16_avx2;
  }
  aom_sad_skip_32x16x4d = aom_sad_skip_32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x16x4d = aom_sad_skip_32x16x4d_avx2;
  }
  aom_sad_skip_32x32 = aom_sad_skip_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x32 = aom_sad_skip_32x32_avx2;
  }
  aom_sad_skip_32x32x4d = aom_sad_skip_32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x32x4d = aom_sad_skip_32x32x4d_avx2;
  }
  aom_sad_skip_32x64 = aom_sad_skip_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x64 = aom_sad_skip_32x64_avx2;
  }
  aom_sad_skip_32x64x4d = aom_sad_skip_32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x64x4d = aom_sad_skip_32x64x4d_avx2;
  }
  aom_sad_skip_64x128 = aom_sad_skip_64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x128 = aom_sad_skip_64x128_avx2;
  }
  aom_sad_skip_64x128x4d = aom_sad_skip_64x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x128x4d = aom_sad_skip_64x128x4d_avx2;
  }
  aom_sad_skip_64x16x4d = aom_sad_skip_64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x16x4d = aom_sad_skip_64x16x4d_avx2;
  }
  aom_sad_skip_64x32 = aom_sad_skip_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x32 = aom_sad_skip_64x32_avx2;
  }
  aom_sad_skip_64x32x4d = aom_sad_skip_64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x32x4d = aom_sad_skip_64x32x4d_avx2;
  }
  aom_sad_skip_64x64 = aom_sad_skip_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x64 = aom_sad_skip_64x64_avx2;
  }
  aom_sad_skip_64x64x4d = aom_sad_skip_64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x64x4d = aom_sad_skip_64x64x4d_avx2;
  }
  aom_satd = aom_satd_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_satd = aom_satd_avx2;
  }
  aom_satd_lp = aom_satd_lp_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_satd_lp = aom_satd_lp_avx2;
  }
  aom_scaled_2d = aom_scaled_2d_c;
  if ((uVar1 & 0x10) != 0) {
    aom_scaled_2d = aom_scaled_2d_ssse3;
  }
  aom_smooth_h_predictor_16x16 = aom_smooth_h_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x16 = aom_smooth_h_predictor_16x16_ssse3;
  }
  aom_smooth_h_predictor_16x32 = aom_smooth_h_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x32 = aom_smooth_h_predictor_16x32_ssse3;
  }
  aom_smooth_h_predictor_16x4 = aom_smooth_h_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x4 = aom_smooth_h_predictor_16x4_ssse3;
  }
  aom_smooth_h_predictor_16x64 = aom_smooth_h_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x64 = aom_smooth_h_predictor_16x64_ssse3;
  }
  aom_smooth_h_predictor_16x8 = aom_smooth_h_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x8 = aom_smooth_h_predictor_16x8_ssse3;
  }
  aom_smooth_h_predictor_32x16 = aom_smooth_h_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x16 = aom_smooth_h_predictor_32x16_ssse3;
  }
  aom_smooth_h_predictor_32x32 = aom_smooth_h_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x32 = aom_smooth_h_predictor_32x32_ssse3;
  }
  aom_smooth_h_predictor_32x64 = aom_smooth_h_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x64 = aom_smooth_h_predictor_32x64_ssse3;
  }
  aom_smooth_h_predictor_32x8 = aom_smooth_h_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x8 = aom_smooth_h_predictor_32x8_ssse3;
  }
  aom_smooth_h_predictor_4x16 = aom_smooth_h_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x16 = aom_smooth_h_predictor_4x16_ssse3;
  }
  aom_smooth_h_predictor_4x4 = aom_smooth_h_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x4 = aom_smooth_h_predictor_4x4_ssse3;
  }
  aom_smooth_h_predictor_4x8 = aom_smooth_h_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x8 = aom_smooth_h_predictor_4x8_ssse3;
  }
  aom_smooth_h_predictor_64x16 = aom_smooth_h_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x16 = aom_smooth_h_predictor_64x16_ssse3;
  }
  aom_smooth_h_predictor_64x32 = aom_smooth_h_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x32 = aom_smooth_h_predictor_64x32_ssse3;
  }
  aom_smooth_h_predictor_64x64 = aom_smooth_h_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x64 = aom_smooth_h_predictor_64x64_ssse3;
  }
  aom_smooth_h_predictor_8x16 = aom_smooth_h_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x16 = aom_smooth_h_predictor_8x16_ssse3;
  }
  aom_smooth_h_predictor_8x32 = aom_smooth_h_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x32 = aom_smooth_h_predictor_8x32_ssse3;
  }
  aom_smooth_h_predictor_8x4 = aom_smooth_h_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x4 = aom_smooth_h_predictor_8x4_ssse3;
  }
  aom_smooth_h_predictor_8x8 = aom_smooth_h_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x8 = aom_smooth_h_predictor_8x8_ssse3;
  }
  aom_smooth_predictor_16x16 = aom_smooth_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x16 = aom_smooth_predictor_16x16_ssse3;
  }
  aom_smooth_predictor_16x32 = aom_smooth_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x32 = aom_smooth_predictor_16x32_ssse3;
  }
  aom_smooth_predictor_16x4 = aom_smooth_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x4 = aom_smooth_predictor_16x4_ssse3;
  }
  aom_smooth_predictor_16x64 = aom_smooth_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x64 = aom_smooth_predictor_16x64_ssse3;
  }
  aom_smooth_predictor_16x8 = aom_smooth_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x8 = aom_smooth_predictor_16x8_ssse3;
  }
  aom_smooth_predictor_32x16 = aom_smooth_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x16 = aom_smooth_predictor_32x16_ssse3;
  }
  aom_smooth_predictor_32x32 = aom_smooth_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x32 = aom_smooth_predictor_32x32_ssse3;
  }
  aom_smooth_predictor_32x64 = aom_smooth_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x64 = aom_smooth_predictor_32x64_ssse3;
  }
  aom_smooth_predictor_32x8 = aom_smooth_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x8 = aom_smooth_predictor_32x8_ssse3;
  }
  aom_smooth_predictor_4x16 = aom_smooth_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x16 = aom_smooth_predictor_4x16_ssse3;
  }
  aom_smooth_predictor_4x4 = aom_smooth_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x4 = aom_smooth_predictor_4x4_ssse3;
  }
  aom_smooth_predictor_4x8 = aom_smooth_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x8 = aom_smooth_predictor_4x8_ssse3;
  }
  aom_smooth_predictor_64x16 = aom_smooth_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x16 = aom_smooth_predictor_64x16_ssse3;
  }
  aom_smooth_predictor_64x32 = aom_smooth_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x32 = aom_smooth_predictor_64x32_ssse3;
  }
  aom_smooth_predictor_64x64 = aom_smooth_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x64 = aom_smooth_predictor_64x64_ssse3;
  }
  aom_smooth_predictor_8x16 = aom_smooth_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x16 = aom_smooth_predictor_8x16_ssse3;
  }
  aom_smooth_predictor_8x32 = aom_smooth_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x32 = aom_smooth_predictor_8x32_ssse3;
  }
  aom_smooth_predictor_8x4 = aom_smooth_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x4 = aom_smooth_predictor_8x4_ssse3;
  }
  aom_smooth_predictor_8x8 = aom_smooth_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x8 = aom_smooth_predictor_8x8_ssse3;
  }
  aom_smooth_v_predictor_16x16 = aom_smooth_v_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x16 = aom_smooth_v_predictor_16x16_ssse3;
  }
  aom_smooth_v_predictor_16x32 = aom_smooth_v_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x32 = aom_smooth_v_predictor_16x32_ssse3;
  }
  aom_smooth_v_predictor_16x4 = aom_smooth_v_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x4 = aom_smooth_v_predictor_16x4_ssse3;
  }
  aom_smooth_v_predictor_16x64 = aom_smooth_v_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x64 = aom_smooth_v_predictor_16x64_ssse3;
  }
  aom_smooth_v_predictor_16x8 = aom_smooth_v_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x8 = aom_smooth_v_predictor_16x8_ssse3;
  }
  aom_smooth_v_predictor_32x16 = aom_smooth_v_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x16 = aom_smooth_v_predictor_32x16_ssse3;
  }
  aom_smooth_v_predictor_32x32 = aom_smooth_v_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x32 = aom_smooth_v_predictor_32x32_ssse3;
  }
  aom_smooth_v_predictor_32x64 = aom_smooth_v_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x64 = aom_smooth_v_predictor_32x64_ssse3;
  }
  aom_smooth_v_predictor_32x8 = aom_smooth_v_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x8 = aom_smooth_v_predictor_32x8_ssse3;
  }
  aom_smooth_v_predictor_4x16 = aom_smooth_v_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x16 = aom_smooth_v_predictor_4x16_ssse3;
  }
  aom_smooth_v_predictor_4x4 = aom_smooth_v_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x4 = aom_smooth_v_predictor_4x4_ssse3;
  }
  aom_smooth_v_predictor_4x8 = aom_smooth_v_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x8 = aom_smooth_v_predictor_4x8_ssse3;
  }
  aom_smooth_v_predictor_64x16 = aom_smooth_v_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x16 = aom_smooth_v_predictor_64x16_ssse3;
  }
  aom_smooth_v_predictor_64x32 = aom_smooth_v_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x32 = aom_smooth_v_predictor_64x32_ssse3;
  }
  aom_smooth_v_predictor_64x64 = aom_smooth_v_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x64 = aom_smooth_v_predictor_64x64_ssse3;
  }
  aom_smooth_v_predictor_8x16 = aom_smooth_v_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x16 = aom_smooth_v_predictor_8x16_ssse3;
  }
  aom_smooth_v_predictor_8x32 = aom_smooth_v_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x32 = aom_smooth_v_predictor_8x32_ssse3;
  }
  aom_smooth_v_predictor_8x4 = aom_smooth_v_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x4 = aom_smooth_v_predictor_8x4_ssse3;
  }
  aom_smooth_v_predictor_8x8 = aom_smooth_v_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x8 = aom_smooth_v_predictor_8x8_ssse3;
  }
  aom_sse = aom_sse_c;
  if ((uVar1 & 0x20) != 0) {
    aom_sse = aom_sse_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sse = aom_sse_avx2;
  }
  aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_avx2;
  }
  aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_avx2;
  }
  aom_sub_pixel_avg_variance16x16 = aom_sub_pixel_avg_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x16 = aom_sub_pixel_avg_variance16x16_ssse3;
  }
  aom_sub_pixel_avg_variance16x32 = aom_sub_pixel_avg_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x32 = aom_sub_pixel_avg_variance16x32_ssse3;
  }
  aom_sub_pixel_avg_variance16x4 = aom_sub_pixel_avg_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x4 = aom_sub_pixel_avg_variance16x4_ssse3;
  }
  aom_sub_pixel_avg_variance16x64 = aom_sub_pixel_avg_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x64 = aom_sub_pixel_avg_variance16x64_ssse3;
  }
  aom_sub_pixel_avg_variance16x8 = aom_sub_pixel_avg_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x8 = aom_sub_pixel_avg_variance16x8_ssse3;
  }
  aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_avx2;
  }
  aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_avx2;
  }
  aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_avx2;
  }
  aom_sub_pixel_avg_variance32x8 = aom_sub_pixel_avg_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x8 = aom_sub_pixel_avg_variance32x8_ssse3;
  }
  aom_sub_pixel_avg_variance4x16 = aom_sub_pixel_avg_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x16 = aom_sub_pixel_avg_variance4x16_ssse3;
  }
  aom_sub_pixel_avg_variance4x4 = aom_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x4 = aom_sub_pixel_avg_variance4x4_ssse3;
  }
  aom_sub_pixel_avg_variance4x8 = aom_sub_pixel_avg_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x8 = aom_sub_pixel_avg_variance4x8_ssse3;
  }
  aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_avx2;
  }
  aom_sub_pixel_avg_variance64x16 = aom_sub_pixel_avg_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x16 = aom_sub_pixel_avg_variance64x16_ssse3;
  }
  aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_avx2;
  }
  aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_avx2;
  }
  aom_sub_pixel_avg_variance8x16 = aom_sub_pixel_avg_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x16 = aom_sub_pixel_avg_variance8x16_ssse3;
  }
  aom_sub_pixel_avg_variance8x32 = aom_sub_pixel_avg_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x32 = aom_sub_pixel_avg_variance8x32_ssse3;
  }
  aom_sub_pixel_avg_variance8x4 = aom_sub_pixel_avg_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x4 = aom_sub_pixel_avg_variance8x4_ssse3;
  }
  aom_sub_pixel_avg_variance8x8 = aom_sub_pixel_avg_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x8 = aom_sub_pixel_avg_variance8x8_ssse3;
  }
  aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_avx2;
  }
  aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_avx2;
  }
  aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_avx2;
  }
  aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_avx2;
  }
  aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_avx2;
  }
  aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_avx2;
  }
  aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_avx2;
  }
  aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_avx2;
  }
  aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_avx2;
  }
  aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_avx2;
  }
  aom_sub_pixel_variance32x8 = aom_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x8 = aom_sub_pixel_variance32x8_ssse3;
  }
  aom_sub_pixel_variance4x16 = aom_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x16 = aom_sub_pixel_variance4x16_ssse3;
  }
  aom_sub_pixel_variance4x4 = aom_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x4 = aom_sub_pixel_variance4x4_ssse3;
  }
  aom_sub_pixel_variance4x8 = aom_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x8 = aom_sub_pixel_variance4x8_ssse3;
  }
  aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_avx2;
  }
  aom_sub_pixel_variance64x16 = aom_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x16 = aom_sub_pixel_variance64x16_ssse3;
  }
  aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_avx2;
  }
  aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_avx2;
  }
  aom_sub_pixel_variance8x16 = aom_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x16 = aom_sub_pixel_variance8x16_ssse3;
  }
  aom_sub_pixel_variance8x32 = aom_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x32 = aom_sub_pixel_variance8x32_ssse3;
  }
  aom_sub_pixel_variance8x4 = aom_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x4 = aom_sub_pixel_variance8x4_ssse3;
  }
  aom_sub_pixel_variance8x8 = aom_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x8 = aom_sub_pixel_variance8x8_ssse3;
  }
  aom_subtract_block = aom_subtract_block_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_subtract_block = aom_subtract_block_avx2;
  }
  aom_sum_squares_2d_i16 = aom_sum_squares_2d_i16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sum_squares_2d_i16 = aom_sum_squares_2d_i16_avx2;
  }
  aom_sum_sse_2d_i16 = aom_sum_sse_2d_i16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sum_sse_2d_i16 = aom_sum_sse_2d_i16_avx2;
  }
  aom_v_predictor_32x16 = aom_v_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x16 = aom_v_predictor_32x16_avx2;
  }
  aom_v_predictor_32x32 = aom_v_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x32 = aom_v_predictor_32x32_avx2;
  }
  aom_v_predictor_32x64 = aom_v_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x64 = aom_v_predictor_32x64_avx2;
  }
  aom_v_predictor_64x16 = aom_v_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x16 = aom_v_predictor_64x16_avx2;
  }
  aom_v_predictor_64x32 = aom_v_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x32 = aom_v_predictor_64x32_avx2;
  }
  aom_v_predictor_64x64 = aom_v_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x64 = aom_v_predictor_64x64_avx2;
  }
  aom_var_2d_u16 = aom_var_2d_u16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_var_2d_u16 = aom_var_2d_u16_avx2;
  }
  aom_var_2d_u8 = aom_var_2d_u8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_var_2d_u8 = aom_var_2d_u8_avx2;
  }
  aom_variance128x128 = aom_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance128x128 = aom_variance128x128_avx2;
  }
  aom_variance128x64 = aom_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance128x64 = aom_variance128x64_avx2;
  }
  aom_variance16x16 = aom_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x16 = aom_variance16x16_avx2;
  }
  aom_variance16x32 = aom_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x32 = aom_variance16x32_avx2;
  }
  aom_variance16x4 = aom_variance16x4_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x4 = aom_variance16x4_avx2;
  }
  aom_variance16x64 = aom_variance16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x64 = aom_variance16x64_avx2;
  }
  aom_variance16x8 = aom_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x8 = aom_variance16x8_avx2;
  }
  aom_variance32x16 = aom_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x16 = aom_variance32x16_avx2;
  }
  aom_variance32x32 = aom_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x32 = aom_variance32x32_avx2;
  }
  aom_variance32x64 = aom_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x64 = aom_variance32x64_avx2;
  }
  aom_variance32x8 = aom_variance32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x8 = aom_variance32x8_avx2;
  }
  aom_variance64x128 = aom_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x128 = aom_variance64x128_avx2;
  }
  aom_variance64x16 = aom_variance64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x16 = aom_variance64x16_avx2;
  }
  aom_variance64x32 = aom_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x32 = aom_variance64x32_avx2;
  }
  aom_variance64x64 = aom_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x64 = aom_variance64x64_avx2;
  }
  aom_vector_var = aom_vector_var_c;
  if ((uVar1 & 0x20) != 0) {
    aom_vector_var = aom_vector_var_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_vector_var = aom_vector_var_avx2;
  }
  return;
}

Assistant:

static void setup_rtcd_internal(void)
{
    int flags = x86_simd_caps();

    (void)flags;

    av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_c;
    if (flags & HAS_SSE4_1) av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_sse4_1;
    if (flags & HAS_AVX2) av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_avx2;
    av1_apply_temporal_filter = av1_apply_temporal_filter_sse2;
    if (flags & HAS_AVX2) av1_apply_temporal_filter = av1_apply_temporal_filter_avx2;
    av1_block_error = av1_block_error_sse2;
    if (flags & HAS_AVX2) av1_block_error = av1_block_error_avx2;
    av1_block_error_lp = av1_block_error_lp_sse2;
    if (flags & HAS_AVX2) av1_block_error_lp = av1_block_error_lp_avx2;
    av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_c;
    if (flags & HAS_SSE4_1) av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_sse4_1;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_avx2;
    av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_c;
    if (flags & HAS_SSE4_1) av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_sse4_1;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_avx2;
    av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_c;
    if (flags & HAS_SSSE3) av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_ssse3;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_avx2;
    av1_calc_indices_dim1 = av1_calc_indices_dim1_sse2;
    if (flags & HAS_AVX2) av1_calc_indices_dim1 = av1_calc_indices_dim1_avx2;
    av1_calc_indices_dim2 = av1_calc_indices_dim2_sse2;
    if (flags & HAS_AVX2) av1_calc_indices_dim2 = av1_calc_indices_dim2_avx2;
    av1_calc_proj_params = av1_calc_proj_params_c;
    if (flags & HAS_SSE4_1) av1_calc_proj_params = av1_calc_proj_params_sse4_1;
    if (flags & HAS_AVX2) av1_calc_proj_params = av1_calc_proj_params_avx2;
    av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_c;
    if (flags & HAS_SSE4_1) av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_sse4_1;
    if (flags & HAS_AVX2) av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_avx2;
    av1_cnn_convolve_no_maxpool_padding_valid = av1_cnn_convolve_no_maxpool_padding_valid_c;
    if (flags & HAS_AVX2) av1_cnn_convolve_no_maxpool_padding_valid = av1_cnn_convolve_no_maxpool_padding_valid_avx2;
    av1_compute_stats = av1_compute_stats_c;
    if (flags & HAS_SSE4_1) av1_compute_stats = av1_compute_stats_sse4_1;
    if (flags & HAS_AVX2) av1_compute_stats = av1_compute_stats_avx2;
    av1_compute_stats_highbd = av1_compute_stats_highbd_c;
    if (flags & HAS_SSE4_1) av1_compute_stats_highbd = av1_compute_stats_highbd_sse4_1;
    if (flags & HAS_AVX2) av1_compute_stats_highbd = av1_compute_stats_highbd_avx2;
    av1_convolve_2d_scale = av1_convolve_2d_scale_c;
    if (flags & HAS_SSE4_1) av1_convolve_2d_scale = av1_convolve_2d_scale_sse4_1;
    av1_convolve_2d_sr = av1_convolve_2d_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_2d_sr = av1_convolve_2d_sr_avx2;
    av1_convolve_horiz_rs = av1_convolve_horiz_rs_c;
    if (flags & HAS_SSE4_1) av1_convolve_horiz_rs = av1_convolve_horiz_rs_sse4_1;
    av1_convolve_x_sr = av1_convolve_x_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_x_sr = av1_convolve_x_sr_avx2;
    av1_convolve_y_sr = av1_convolve_y_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_y_sr = av1_convolve_y_sr_avx2;
    av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_c;
    if (flags & HAS_SSSE3) av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_ssse3;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_avx2;
    av1_dist_wtd_convolve_2d_copy = av1_dist_wtd_convolve_2d_copy_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_2d_copy = av1_dist_wtd_convolve_2d_copy_avx2;
    av1_dist_wtd_convolve_x = av1_dist_wtd_convolve_x_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_x = av1_dist_wtd_convolve_x_avx2;
    av1_dist_wtd_convolve_y = av1_dist_wtd_convolve_y_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_y = av1_dist_wtd_convolve_y_avx2;
    av1_dr_prediction_z1 = av1_dr_prediction_z1_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z1 = av1_dr_prediction_z1_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z1 = av1_dr_prediction_z1_avx2;
    av1_dr_prediction_z2 = av1_dr_prediction_z2_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z2 = av1_dr_prediction_z2_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z2 = av1_dr_prediction_z2_avx2;
    av1_dr_prediction_z3 = av1_dr_prediction_z3_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z3 = av1_dr_prediction_z3_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z3 = av1_dr_prediction_z3_avx2;
    av1_estimate_noise_from_single_plane = av1_estimate_noise_from_single_plane_c;
    if (flags & HAS_AVX2) av1_estimate_noise_from_single_plane = av1_estimate_noise_from_single_plane_avx2;
    av1_filter_intra_edge = av1_filter_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_filter_intra_edge = av1_filter_intra_edge_sse4_1;
    av1_filter_intra_predictor = av1_filter_intra_predictor_c;
    if (flags & HAS_SSE4_1) av1_filter_intra_predictor = av1_filter_intra_predictor_sse4_1;
    av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_avx2;
    av1_fwd_txfm2d_16x32 = av1_fwd_txfm2d_16x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x32 = av1_fwd_txfm2d_16x32_sse4_1;
    av1_fwd_txfm2d_16x4 = av1_fwd_txfm2d_16x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x4 = av1_fwd_txfm2d_16x4_sse4_1;
    av1_fwd_txfm2d_16x64 = av1_fwd_txfm2d_16x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x64 = av1_fwd_txfm2d_16x64_sse4_1;
    av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_avx2;
    av1_fwd_txfm2d_32x16 = av1_fwd_txfm2d_32x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x16 = av1_fwd_txfm2d_32x16_sse4_1;
    av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_avx2;
    av1_fwd_txfm2d_32x64 = av1_fwd_txfm2d_32x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x64 = av1_fwd_txfm2d_32x64_sse4_1;
    av1_fwd_txfm2d_32x8 = av1_fwd_txfm2d_32x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x8 = av1_fwd_txfm2d_32x8_sse4_1;
    av1_fwd_txfm2d_4x16 = av1_fwd_txfm2d_4x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x16 = av1_fwd_txfm2d_4x16_sse4_1;
    av1_fwd_txfm2d_4x4 = av1_fwd_txfm2d_4x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x4 = av1_fwd_txfm2d_4x4_sse4_1;
    av1_fwd_txfm2d_4x8 = av1_fwd_txfm2d_4x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x8 = av1_fwd_txfm2d_4x8_sse4_1;
    av1_fwd_txfm2d_64x16 = av1_fwd_txfm2d_64x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x16 = av1_fwd_txfm2d_64x16_sse4_1;
    av1_fwd_txfm2d_64x32 = av1_fwd_txfm2d_64x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x32 = av1_fwd_txfm2d_64x32_sse4_1;
    av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_avx2;
    av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_avx2;
    av1_fwd_txfm2d_8x32 = av1_fwd_txfm2d_8x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x32 = av1_fwd_txfm2d_8x32_sse4_1;
    av1_fwd_txfm2d_8x4 = av1_fwd_txfm2d_8x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x4 = av1_fwd_txfm2d_8x4_sse4_1;
    av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_avx2;
    av1_fwht4x4 = av1_fwht4x4_c;
    if (flags & HAS_SSE4_1) av1_fwht4x4 = av1_fwht4x4_sse4_1;
    av1_get_crc32c_value = av1_get_crc32c_value_c;
    if (flags & HAS_SSE4_2) av1_get_crc32c_value = av1_get_crc32c_value_sse4_2;
    av1_get_horver_correlation_full = av1_get_horver_correlation_full_c;
    if (flags & HAS_SSE4_1) av1_get_horver_correlation_full = av1_get_horver_correlation_full_sse4_1;
    if (flags & HAS_AVX2) av1_get_horver_correlation_full = av1_get_horver_correlation_full_avx2;
    av1_highbd_apply_temporal_filter = av1_highbd_apply_temporal_filter_sse2;
    if (flags & HAS_AVX2) av1_highbd_apply_temporal_filter = av1_highbd_apply_temporal_filter_avx2;
    av1_highbd_block_error = av1_highbd_block_error_sse2;
    if (flags & HAS_AVX2) av1_highbd_block_error = av1_highbd_block_error_avx2;
    av1_highbd_convolve_2d_scale = av1_highbd_convolve_2d_scale_c;
    if (flags & HAS_SSE4_1) av1_highbd_convolve_2d_scale = av1_highbd_convolve_2d_scale_sse4_1;
    av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_avx2;
    av1_highbd_convolve_horiz_rs = av1_highbd_convolve_horiz_rs_c;
    if (flags & HAS_SSE4_1) av1_highbd_convolve_horiz_rs = av1_highbd_convolve_horiz_rs_sse4_1;
    av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_avx2;
    av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_avx2;
    av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_avx2;
    av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_avx2;
    av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_avx2;
    av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_avx2;
    av1_highbd_dr_prediction_z1 = av1_highbd_dr_prediction_z1_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z1 = av1_highbd_dr_prediction_z1_avx2;
    av1_highbd_dr_prediction_z2 = av1_highbd_dr_prediction_z2_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z2 = av1_highbd_dr_prediction_z2_avx2;
    av1_highbd_dr_prediction_z3 = av1_highbd_dr_prediction_z3_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z3 = av1_highbd_dr_prediction_z3_avx2;
    av1_highbd_filter_intra_edge = av1_highbd_filter_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_highbd_filter_intra_edge = av1_highbd_filter_intra_edge_sse4_1;
    av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_c;
    if (flags & HAS_SSE4_1) av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_avx2;
    av1_highbd_iwht4x4_16_add = av1_highbd_iwht4x4_16_add_c;
    if (flags & HAS_SSE4_1) av1_highbd_iwht4x4_16_add = av1_highbd_iwht4x4_16_add_sse4_1;
    av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_c;
    if (flags & HAS_SSE4_1) av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_avx2;
    av1_highbd_quantize_fp = av1_highbd_quantize_fp_c;
    if (flags & HAS_SSE4_1) av1_highbd_quantize_fp = av1_highbd_quantize_fp_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_quantize_fp = av1_highbd_quantize_fp_avx2;
    av1_highbd_upsample_intra_edge = av1_highbd_upsample_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_highbd_upsample_intra_edge = av1_highbd_upsample_intra_edge_sse4_1;
    av1_highbd_warp_affine = av1_highbd_warp_affine_c;
    if (flags & HAS_SSE4_1) av1_highbd_warp_affine = av1_highbd_warp_affine_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_warp_affine = av1_highbd_warp_affine_avx2;
    av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_c;
    if (flags & HAS_SSSE3) av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_ssse3;
    if (flags & HAS_AVX2) av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_avx2;
    av1_inv_txfm2d_add_4x4 = av1_inv_txfm2d_add_4x4_c;
    if (flags & HAS_SSE4_1) av1_inv_txfm2d_add_4x4 = av1_inv_txfm2d_add_4x4_sse4_1;
    av1_inv_txfm2d_add_8x8 = av1_inv_txfm2d_add_8x8_c;
    if (flags & HAS_SSE4_1) av1_inv_txfm2d_add_8x8 = av1_inv_txfm2d_add_8x8_sse4_1;
    av1_inv_txfm_add = av1_inv_txfm_add_c;
    if (flags & HAS_SSSE3) av1_inv_txfm_add = av1_inv_txfm_add_ssse3;
    if (flags & HAS_AVX2) av1_inv_txfm_add = av1_inv_txfm_add_avx2;
    av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_c;
    if (flags & HAS_SSE4_1) av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_sse4_1;
    if (flags & HAS_AVX2) av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_avx2;
    av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_c;
    if (flags & HAS_SSE4_1) av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_sse4_1;
    if (flags & HAS_AVX2) av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_avx2;
    av1_nn_fast_softmax_16 = av1_nn_fast_softmax_16_c;
    if (flags & HAS_SSE3) av1_nn_fast_softmax_16 = av1_nn_fast_softmax_16_sse3;
    av1_nn_predict = av1_nn_predict_c;
    if (flags & HAS_SSE3) av1_nn_predict = av1_nn_predict_sse3;
    if (flags & HAS_AVX2) av1_nn_predict = av1_nn_predict_avx2;
    av1_quantize_fp = av1_quantize_fp_sse2;
    if (flags & HAS_AVX2) av1_quantize_fp = av1_quantize_fp_avx2;
    av1_quantize_fp_32x32 = av1_quantize_fp_32x32_c;
    if (flags & HAS_AVX2) av1_quantize_fp_32x32 = av1_quantize_fp_32x32_avx2;
    av1_quantize_fp_64x64 = av1_quantize_fp_64x64_c;
    if (flags & HAS_AVX2) av1_quantize_fp_64x64 = av1_quantize_fp_64x64_avx2;
    av1_quantize_lp = av1_quantize_lp_sse2;
    if (flags & HAS_AVX2) av1_quantize_lp = av1_quantize_lp_avx2;
    av1_resize_and_extend_frame = av1_resize_and_extend_frame_c;
    if (flags & HAS_SSSE3) av1_resize_and_extend_frame = av1_resize_and_extend_frame_ssse3;
    av1_resize_horz_dir = av1_resize_horz_dir_sse2;
    if (flags & HAS_AVX2) av1_resize_horz_dir = av1_resize_horz_dir_avx2;
    av1_resize_vert_dir = av1_resize_vert_dir_sse2;
    if (flags & HAS_AVX2) av1_resize_vert_dir = av1_resize_vert_dir_avx2;
    av1_round_shift_array = av1_round_shift_array_c;
    if (flags & HAS_SSE4_1) av1_round_shift_array = av1_round_shift_array_sse4_1;
    av1_selfguided_restoration = av1_selfguided_restoration_c;
    if (flags & HAS_SSE4_1) av1_selfguided_restoration = av1_selfguided_restoration_sse4_1;
    if (flags & HAS_AVX2) av1_selfguided_restoration = av1_selfguided_restoration_avx2;
    av1_txb_init_levels = av1_txb_init_levels_c;
    if (flags & HAS_SSE4_1) av1_txb_init_levels = av1_txb_init_levels_sse4_1;
    if (flags & HAS_AVX2) av1_txb_init_levels = av1_txb_init_levels_avx2;
    av1_upsample_intra_edge = av1_upsample_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_upsample_intra_edge = av1_upsample_intra_edge_sse4_1;
    av1_warp_affine = av1_warp_affine_c;
    if (flags & HAS_SSE4_1) av1_warp_affine = av1_warp_affine_sse4_1;
    if (flags & HAS_AVX2) av1_warp_affine = av1_warp_affine_avx2;
    av1_wedge_compute_delta_squares = av1_wedge_compute_delta_squares_sse2;
    if (flags & HAS_AVX2) av1_wedge_compute_delta_squares = av1_wedge_compute_delta_squares_avx2;
    av1_wedge_sign_from_residuals = av1_wedge_sign_from_residuals_sse2;
    if (flags & HAS_AVX2) av1_wedge_sign_from_residuals = av1_wedge_sign_from_residuals_avx2;
    av1_wedge_sse_from_residuals = av1_wedge_sse_from_residuals_sse2;
    if (flags & HAS_AVX2) av1_wedge_sse_from_residuals = av1_wedge_sse_from_residuals_avx2;
    av1_wiener_convolve_add_src = av1_wiener_convolve_add_src_sse2;
    if (flags & HAS_AVX2) av1_wiener_convolve_add_src = av1_wiener_convolve_add_src_avx2;
    cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_c;
    if (flags & HAS_SSE4_1) cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_sse4_1;
    if (flags & HAS_AVX2) cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_avx2;
    cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_c;
    if (flags & HAS_SSE4_1) cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_sse4_1;
    if (flags & HAS_AVX2) cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_avx2;
    cdef_filter_16_0 = cdef_filter_16_0_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_0 = cdef_filter_16_0_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_0 = cdef_filter_16_0_avx2;
    cdef_filter_16_1 = cdef_filter_16_1_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_1 = cdef_filter_16_1_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_1 = cdef_filter_16_1_avx2;
    cdef_filter_16_2 = cdef_filter_16_2_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_2 = cdef_filter_16_2_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_2 = cdef_filter_16_2_avx2;
    cdef_filter_16_3 = cdef_filter_16_3_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_3 = cdef_filter_16_3_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_3 = cdef_filter_16_3_avx2;
    cdef_filter_8_0 = cdef_filter_8_0_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_0 = cdef_filter_8_0_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_0 = cdef_filter_8_0_avx2;
    cdef_filter_8_1 = cdef_filter_8_1_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_1 = cdef_filter_8_1_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_1 = cdef_filter_8_1_avx2;
    cdef_filter_8_2 = cdef_filter_8_2_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_2 = cdef_filter_8_2_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_2 = cdef_filter_8_2_avx2;
    cdef_filter_8_3 = cdef_filter_8_3_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_3 = cdef_filter_8_3_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_3 = cdef_filter_8_3_avx2;
    cdef_find_dir = cdef_find_dir_c;
    if (flags & HAS_SSE4_1) cdef_find_dir = cdef_find_dir_sse4_1;
    if (flags & HAS_AVX2) cdef_find_dir = cdef_find_dir_avx2;
    cdef_find_dir_dual = cdef_find_dir_dual_c;
    if (flags & HAS_SSE4_1) cdef_find_dir_dual = cdef_find_dir_dual_sse4_1;
    if (flags & HAS_AVX2) cdef_find_dir_dual = cdef_find_dir_dual_avx2;
    cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_avx2;
    cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_avx2;
    cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_avx2;
    cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_avx2;
    cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_avx2;
    cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_avx2;
    cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_c;
    if (flags & HAS_SSSE3) cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_ssse3;
    if (flags & HAS_AVX2) cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_avx2;
    cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_c;
    if (flags & HAS_SSSE3) cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_ssse3;
    if (flags & HAS_AVX2) cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_avx2;
    cfl_get_subtract_average_fn = cfl_get_subtract_average_fn_sse2;
    if (flags & HAS_AVX2) cfl_get_subtract_average_fn = cfl_get_subtract_average_fn_avx2;
}